

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O1

size_t KeccakF1600_FastLoop_Absorb(void *state,uint laneCount,uchar *data,size_t dataByteLen)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_98;
  
  local_140 = *state;
  local_138 = *(ulong *)((long)state + 8);
  local_d0 = *(ulong *)((long)state + 0x10);
  local_130 = *(ulong *)((long)state + 0x18);
  local_e0 = *(ulong *)((long)state + 0x20);
  local_e8 = *(ulong *)((long)state + 0x28);
  local_128 = *(ulong *)((long)state + 0x30);
  local_d8 = *(ulong *)((long)state + 0x38);
  local_f0 = *(ulong *)((long)state + 0x40);
  local_120 = *(ulong *)((long)state + 0x48);
  local_f8 = *(ulong *)((long)state + 0x50);
  local_100 = *(ulong *)((long)state + 0x58);
  local_118 = *(ulong *)((long)state + 0x60);
  local_148 = *(ulong *)((long)state + 0x68);
  uVar11 = *(ulong *)((long)state + 0x70);
  uVar21 = *(ulong *)((long)state + 0x78);
  local_108 = *(ulong *)((long)state + 0x80);
  local_150 = *(ulong *)((long)state + 0x88);
  local_110 = *(ulong *)((long)state + 0x90);
  local_158 = *(ulong *)((long)state + 0x98);
  uVar26 = *(ulong *)((long)state + 0xa0);
  local_98 = *(ulong *)((long)state + 0xa8);
  local_c8 = *(ulong *)((long)state + 0xb0);
  local_b8 = *(ulong *)((long)state + 0xb8);
  local_c0 = *(ulong *)((long)state + 0xc0);
  uVar16 = (ulong)(laneCount * 8);
  uVar20 = dataByteLen;
  if (uVar16 <= dataByteLen) {
    do {
      if (laneCount == 0x15) {
        local_140 = local_140 ^ *(ulong *)data;
        local_138 = local_138 ^ *(ulong *)((long)data + 8);
        local_d0 = local_d0 ^ *(ulong *)((long)data + 0x10);
        local_130 = local_130 ^ *(ulong *)((long)data + 0x18);
        local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
        local_e8 = local_e8 ^ *(ulong *)((long)data + 0x28);
        local_128 = local_128 ^ *(ulong *)((long)data + 0x30);
        local_d8 = local_d8 ^ *(ulong *)((long)data + 0x38);
        local_f0 = local_f0 ^ *(ulong *)((long)data + 0x40);
        local_120 = local_120 ^ *(ulong *)((long)data + 0x48);
        local_f8 = local_f8 ^ *(ulong *)((long)data + 0x50);
        local_100 = local_100 ^ *(ulong *)((long)data + 0x58);
        local_118 = local_118 ^ *(ulong *)((long)data + 0x60);
        local_148 = local_148 ^ *(ulong *)((long)data + 0x68);
        uVar11 = uVar11 ^ *(ulong *)((long)data + 0x70);
        uVar21 = uVar21 ^ *(ulong *)((long)data + 0x78);
        local_108 = local_108 ^ *(ulong *)((long)data + 0x80);
        local_150 = local_150 ^ *(ulong *)((long)data + 0x88);
        local_110 = local_110 ^ *(ulong *)((long)data + 0x90);
        local_158 = local_158 ^ *(ulong *)((long)data + 0x98);
        uVar26 = uVar26 ^ *(ulong *)((long)data + 0xa0);
      }
      else if (laneCount < 0x10) {
        if (laneCount < 8) {
          if (laneCount < 4) {
            if (laneCount < 2) {
              if (laneCount != 0) {
                local_140 = local_140 ^ *(ulong *)data;
              }
            }
            else {
              local_140 = local_140 ^ *(ulong *)data;
              local_138 = local_138 ^ *(ulong *)((long)data + 8);
              if (laneCount == 3) {
                local_d0 = local_d0 ^ *(ulong *)((long)data + 0x10);
              }
            }
          }
          else {
            local_140 = local_140 ^ *(ulong *)data;
            local_138 = local_138 ^ *(ulong *)((long)data + 8);
            local_d0 = local_d0 ^ *(ulong *)((long)data + 0x10);
            local_130 = local_130 ^ *(ulong *)((long)data + 0x18);
            if (laneCount < 6) {
              if (laneCount != 4) {
                local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
              }
            }
            else {
              local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
              local_e8 = local_e8 ^ *(ulong *)((long)data + 0x28);
              if (laneCount == 7) {
                local_128 = local_128 ^ *(ulong *)((long)data + 0x30);
              }
            }
          }
        }
        else {
          local_140 = local_140 ^ *(ulong *)data;
          local_138 = local_138 ^ *(ulong *)((long)data + 8);
          local_d0 = local_d0 ^ *(ulong *)((long)data + 0x10);
          local_130 = local_130 ^ *(ulong *)((long)data + 0x18);
          local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
          local_e8 = local_e8 ^ *(ulong *)((long)data + 0x28);
          local_128 = local_128 ^ *(ulong *)((long)data + 0x30);
          local_d8 = local_d8 ^ *(ulong *)((long)data + 0x38);
          if (laneCount < 0xc) {
            if (laneCount < 10) {
              if (laneCount != 8) {
                local_f0 = local_f0 ^ *(ulong *)((long)data + 0x40);
              }
            }
            else {
              local_f0 = local_f0 ^ *(ulong *)((long)data + 0x40);
              local_120 = local_120 ^ *(ulong *)((long)data + 0x48);
              if (laneCount == 0xb) {
                local_f8 = local_f8 ^ *(ulong *)((long)data + 0x50);
              }
            }
          }
          else {
            local_f0 = local_f0 ^ *(ulong *)((long)data + 0x40);
            local_120 = local_120 ^ *(ulong *)((long)data + 0x48);
            local_f8 = local_f8 ^ *(ulong *)((long)data + 0x50);
            local_100 = local_100 ^ *(ulong *)((long)data + 0x58);
            if (laneCount < 0xe) {
              if (laneCount != 0xc) {
                local_118 = local_118 ^ *(ulong *)((long)data + 0x60);
              }
            }
            else {
              local_118 = local_118 ^ *(ulong *)((long)data + 0x60);
              local_148 = local_148 ^ *(ulong *)((long)data + 0x68);
              if (laneCount == 0xf) {
                uVar11 = uVar11 ^ *(ulong *)((long)data + 0x70);
              }
            }
          }
        }
      }
      else {
        local_140 = local_140 ^ *(ulong *)data;
        local_138 = local_138 ^ *(ulong *)((long)data + 8);
        local_d0 = local_d0 ^ *(ulong *)((long)data + 0x10);
        local_130 = local_130 ^ *(ulong *)((long)data + 0x18);
        local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
        local_e8 = local_e8 ^ *(ulong *)((long)data + 0x28);
        local_128 = local_128 ^ *(ulong *)((long)data + 0x30);
        local_d8 = local_d8 ^ *(ulong *)((long)data + 0x38);
        local_f0 = local_f0 ^ *(ulong *)((long)data + 0x40);
        local_120 = local_120 ^ *(ulong *)((long)data + 0x48);
        local_f8 = local_f8 ^ *(ulong *)((long)data + 0x50);
        local_100 = local_100 ^ *(ulong *)((long)data + 0x58);
        local_118 = local_118 ^ *(ulong *)((long)data + 0x60);
        local_148 = local_148 ^ *(ulong *)((long)data + 0x68);
        uVar11 = uVar11 ^ *(ulong *)((long)data + 0x70);
        uVar21 = uVar21 ^ *(ulong *)((long)data + 0x78);
        if (laneCount < 0x18) {
          if (laneCount < 0x14) {
            if (laneCount < 0x12) {
              if (laneCount != 0x10) {
                local_108 = local_108 ^ *(ulong *)((long)data + 0x80);
              }
            }
            else {
              local_108 = local_108 ^ *(ulong *)((long)data + 0x80);
              local_150 = local_150 ^ *(ulong *)((long)data + 0x88);
              if (laneCount == 0x13) {
                local_110 = local_110 ^ *(ulong *)((long)data + 0x90);
              }
            }
          }
          else {
            local_108 = local_108 ^ *(ulong *)((long)data + 0x80);
            local_150 = local_150 ^ *(ulong *)((long)data + 0x88);
            local_110 = local_110 ^ *(ulong *)((long)data + 0x90);
            local_158 = local_158 ^ *(ulong *)((long)data + 0x98);
            if (0x15 < laneCount) {
              uVar26 = uVar26 ^ *(ulong *)((long)data + 0xa0);
              local_98 = local_98 ^ *(ulong *)((long)data + 0xa8);
              if (laneCount == 0x17) {
                local_c8 = local_c8 ^ *(ulong *)((long)data + 0xb0);
              }
            }
          }
        }
        else {
          local_108 = local_108 ^ *(ulong *)((long)data + 0x80);
          local_150 = local_150 ^ *(ulong *)((long)data + 0x88);
          local_110 = local_110 ^ *(ulong *)((long)data + 0x90);
          local_158 = local_158 ^ *(ulong *)((long)data + 0x98);
          uVar26 = uVar26 ^ *(ulong *)((long)data + 0xa0);
          local_98 = local_98 ^ *(ulong *)((long)data + 0xa8);
          local_c8 = local_c8 ^ *(ulong *)((long)data + 0xb0);
          local_b8 = local_b8 ^ *(ulong *)((long)data + 0xb8);
          if (laneCount != 0x18) {
            local_c0 = local_c0 ^ *(ulong *)((long)data + 0xc0);
          }
        }
      }
      uVar13 = local_f8 ^ local_e8 ^ uVar21 ^ uVar26 ^ local_140;
      uVar17 = local_100 ^ local_128 ^ local_108 ^ local_98 ^ local_138;
      uVar23 = local_118 ^ local_d8 ^ local_150 ^ local_c8 ^ local_d0;
      uVar38 = local_148 ^ local_f0 ^ local_110 ^ local_b8 ^ local_130;
      uVar27 = uVar11 ^ local_120 ^ local_158 ^ local_c0 ^ local_e0;
      uVar33 = (uVar38 >> 0x3f | uVar38 << 1) ^ uVar17;
      uVar9 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar27;
      uVar30 = (uVar27 >> 0x3f | uVar27 << 1) ^ uVar23;
      uVar28 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar13;
      uVar38 = (uVar13 >> 0x3f | uVar13 << 1) ^ uVar38;
      local_140 = local_140 ^ uVar9;
      uVar18 = (local_128 ^ uVar28) >> 0x14 | (local_128 ^ uVar28) << 0x2c;
      uVar24 = (local_118 ^ uVar33) >> 0x15 | (local_118 ^ uVar33) << 0x2b;
      uVar13 = (local_110 ^ uVar30) >> 0x2b | (local_110 ^ uVar30) << 0x15;
      uVar1 = (local_c0 ^ uVar38) >> 0x32 | (local_c0 ^ uVar38) << 0xe;
      uVar2 = ~uVar1 & local_140 ^ uVar13;
      uVar3 = ~uVar13 & uVar1 ^ uVar24;
      uVar22 = ~uVar24 & uVar13 ^ uVar18;
      uVar1 = ~local_140 & uVar18 ^ uVar1;
      uVar13 = (local_130 ^ uVar30) >> 0x24 | (local_130 ^ uVar30) << 0x1c;
      uVar23 = (local_120 ^ uVar38) >> 0x2c | (local_120 ^ uVar38) << 0x14;
      uVar27 = (local_f8 ^ uVar9) >> 0x3d | (local_f8 ^ uVar9) << 3;
      uVar39 = (local_108 ^ uVar28) >> 0x13 | (local_108 ^ uVar28) << 0x2d;
      uVar17 = (local_c8 ^ uVar33) >> 3 | (local_c8 ^ uVar33) << 0x3d;
      uVar4 = ~uVar17 & uVar13 ^ uVar39;
      uVar5 = ~uVar39 & uVar17 ^ uVar27;
      uVar6 = ~uVar23 & uVar27 ^ uVar13;
      uVar27 = ~uVar27 & uVar39 ^ uVar23;
      uVar17 = ~uVar13 & uVar23 ^ uVar17;
      uVar13 = (local_138 ^ uVar28) >> 0x3f | (local_138 ^ uVar28) << 1;
      uVar23 = (local_d8 ^ uVar33) >> 0x3a | (local_d8 ^ uVar33) << 6;
      uVar25 = (local_148 ^ uVar30) >> 0x27 | (local_148 ^ uVar30) << 0x19;
      uVar36 = (local_158 ^ uVar38) >> 0x38 | (local_158 ^ uVar38) << 8;
      uVar26 = (uVar26 ^ uVar9) >> 0x2e | (uVar26 ^ uVar9) << 0x12;
      uVar7 = ~uVar26 & uVar13 ^ uVar36;
      uVar40 = ~uVar36 & uVar26 ^ uVar25;
      uVar39 = ~uVar23 & uVar25 ^ uVar13;
      uVar36 = ~uVar25 & uVar36 ^ uVar23;
      uVar26 = ~uVar13 & uVar23 ^ uVar26;
      uVar13 = (local_e0 ^ uVar38) >> 0x25 | (local_e0 ^ uVar38) << 0x1b;
      uVar10 = (local_e8 ^ uVar9) >> 0x1c | (local_e8 ^ uVar9) << 0x24;
      uVar25 = (local_100 ^ uVar28) >> 0x36 | (local_100 ^ uVar28) << 10;
      uVar31 = (local_150 ^ uVar33) >> 0x31 | (local_150 ^ uVar33) << 0xf;
      uVar23 = (local_b8 ^ uVar30) >> 8 | (local_b8 ^ uVar30) << 0x38;
      uVar12 = ~uVar23 & uVar13 ^ uVar31;
      uVar32 = ~uVar31 & uVar23 ^ uVar25;
      uVar8 = ~uVar10 & uVar25 ^ uVar13;
      uVar25 = ~uVar25 & uVar31 ^ uVar10;
      uVar23 = ~uVar13 & uVar10 ^ uVar23;
      uVar37 = ~uVar18 & uVar24 ^ local_140 ^ 1;
      uVar24 = (uVar33 ^ local_d0) >> 2 | (uVar33 ^ local_d0) << 0x3e;
      uVar30 = (uVar30 ^ local_f0) >> 9 | (uVar30 ^ local_f0) << 0x37;
      uVar10 = (uVar38 ^ uVar11) >> 0x19 | (uVar38 ^ uVar11) << 0x27;
      uVar14 = ~uVar30 & uVar10 ^ uVar24;
      uVar13 = uVar6 ^ uVar14 ^ uVar39 ^ uVar8 ^ uVar37;
      uVar11 = (uVar9 ^ uVar21) >> 0x17 | (uVar9 ^ uVar21) << 0x29;
      uVar38 = (uVar28 ^ local_98) >> 0x3e | (uVar28 ^ local_98) << 2;
      uVar18 = ~uVar11 & uVar38 ^ uVar10;
      uVar9 = ~uVar38 & uVar24 ^ uVar11;
      uVar34 = ~uVar10 & uVar11 ^ uVar30;
      uVar38 = ~uVar24 & uVar30 ^ uVar38;
      uVar21 = uVar25 ^ uVar36 ^ uVar27 ^ uVar22 ^ uVar34;
      uVar24 = uVar18 ^ uVar3 ^ uVar5 ^ uVar32 ^ uVar40;
      uVar11 = uVar9 ^ uVar2 ^ uVar7 ^ uVar4 ^ uVar12;
      uVar28 = uVar26 ^ uVar17 ^ uVar1 ^ uVar38 ^ uVar23;
      uVar10 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar21;
      uVar15 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar28;
      uVar29 = (uVar28 >> 0x3f | uVar28 << 1) ^ uVar24;
      uVar19 = (uVar24 >> 0x3f | uVar24 << 1) ^ uVar13;
      uVar11 = (uVar13 >> 0x3f | uVar13 << 1) ^ uVar11;
      uVar37 = uVar37 ^ uVar15;
      uVar27 = uVar27 ^ uVar19;
      uVar21 = uVar27 >> 0x14 | uVar27 << 0x2c;
      uVar40 = uVar40 ^ uVar10;
      uVar30 = uVar40 >> 0x15 | uVar40 << 0x2b;
      uVar12 = uVar12 ^ uVar29;
      uVar13 = uVar12 >> 0x2b | uVar12 << 0x15;
      uVar38 = uVar38 ^ uVar11;
      uVar24 = uVar38 >> 0x32 | uVar38 << 0xe;
      uVar12 = ~uVar24 & uVar37 ^ uVar13;
      uVar31 = ~uVar13 & uVar24 ^ uVar30;
      uVar38 = ~uVar30 & uVar13 ^ uVar21;
      uVar24 = ~uVar37 & uVar21 ^ uVar24;
      uVar2 = uVar2 ^ uVar29;
      uVar40 = uVar2 >> 0x24 | uVar2 << 0x1c;
      uVar17 = uVar17 ^ uVar11;
      uVar13 = uVar17 >> 0x2c | uVar17 << 0x14;
      uVar39 = uVar39 ^ uVar15;
      uVar27 = uVar39 >> 0x3d | uVar39 << 3;
      uVar25 = uVar25 ^ uVar19;
      uVar17 = uVar25 >> 0x13 | uVar25 << 0x2d;
      uVar18 = uVar18 ^ uVar10;
      uVar2 = uVar18 >> 3 | uVar18 << 0x3d;
      uVar33 = ~uVar2 & uVar40 ^ uVar17;
      uVar18 = ~uVar17 & uVar2 ^ uVar27;
      uVar28 = ~uVar13 & uVar27 ^ uVar40;
      uVar27 = ~uVar27 & uVar17 ^ uVar13;
      uVar2 = ~uVar40 & uVar13 ^ uVar2;
      uVar22 = uVar22 ^ uVar19;
      uVar13 = uVar22 >> 0x3f | uVar22 << 1;
      uVar5 = uVar5 ^ uVar10;
      uVar25 = uVar5 >> 0x3a | uVar5 << 6;
      uVar7 = uVar7 ^ uVar29;
      uVar7 = uVar7 >> 0x27 | uVar7 << 0x19;
      uVar23 = uVar23 ^ uVar11;
      uVar5 = uVar23 >> 0x38 | uVar23 << 8;
      uVar14 = uVar14 ^ uVar15;
      uVar17 = uVar14 >> 0x2e | uVar14 << 0x12;
      uVar22 = ~uVar17 & uVar13 ^ uVar5;
      uVar23 = ~uVar5 & uVar17 ^ uVar7;
      uVar39 = ~uVar25 & uVar7 ^ uVar13;
      uVar7 = ~uVar7 & uVar5 ^ uVar25;
      uVar17 = ~uVar13 & uVar25 ^ uVar17;
      uVar6 = uVar6 ^ uVar15;
      uVar14 = uVar6 >> 0x1c | uVar6 << 0x24;
      uVar36 = uVar36 ^ uVar19;
      uVar36 = uVar36 >> 0x36 | uVar36 << 10;
      uVar32 = uVar32 ^ uVar10;
      uVar5 = uVar32 >> 0x31 | uVar32 << 0xf;
      uVar25 = ~uVar36 & uVar5 ^ uVar14;
      uVar9 = uVar9 ^ uVar29;
      uVar6 = uVar9 >> 8 | uVar9 << 0x38;
      uVar32 = ~uVar5 & uVar6 ^ uVar36;
      uVar1 = uVar1 ^ uVar11;
      uVar13 = uVar1 >> 0x25 | uVar1 << 0x1b;
      uVar5 = ~uVar6 & uVar13 ^ uVar5;
      uVar40 = ~uVar14 & uVar36 ^ uVar13;
      uVar6 = ~uVar13 & uVar14 ^ uVar6;
      uVar10 = uVar10 ^ uVar3;
      uVar29 = uVar29 ^ uVar4;
      uVar11 = uVar11 ^ uVar26;
      uVar15 = uVar15 ^ uVar8;
      uVar19 = uVar19 ^ uVar34;
      uVar3 = ~uVar21 & uVar30 ^ uVar37 ^ 0x8082;
      uVar13 = uVar10 >> 2 | uVar10 << 0x3e;
      uVar1 = uVar29 >> 9 | uVar29 << 0x37;
      uVar21 = uVar11 >> 0x19 | uVar11 << 0x27;
      uVar36 = ~uVar1 & uVar21 ^ uVar13;
      uVar10 = uVar40 ^ uVar36 ^ uVar28 ^ uVar39 ^ uVar3;
      uVar11 = uVar15 >> 0x17 | uVar15 << 0x29;
      uVar26 = uVar19 >> 0x3e | uVar19 << 2;
      uVar8 = ~uVar11 & uVar26 ^ uVar21;
      uVar9 = ~uVar26 & uVar13 ^ uVar11;
      uVar14 = ~uVar21 & uVar11 ^ uVar1;
      uVar26 = ~uVar13 & uVar1 ^ uVar26;
      uVar21 = uVar7 ^ uVar25 ^ uVar38 ^ uVar27 ^ uVar14;
      uVar13 = uVar23 ^ uVar32 ^ uVar31 ^ uVar18 ^ uVar8;
      uVar30 = uVar22 ^ uVar5 ^ uVar12 ^ uVar33 ^ uVar9;
      uVar11 = uVar17 ^ uVar6 ^ uVar24 ^ uVar2 ^ uVar26;
      uVar19 = (uVar30 >> 0x3f | uVar30 << 1) ^ uVar21;
      uVar29 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar11;
      uVar15 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar13;
      uVar34 = (uVar13 >> 0x3f | uVar13 << 1) ^ uVar10;
      uVar30 = (uVar10 >> 0x3f | uVar10 << 1) ^ uVar30;
      uVar3 = uVar3 ^ uVar29;
      uVar27 = uVar27 ^ uVar34;
      uVar13 = uVar27 >> 0x14 | uVar27 << 0x2c;
      uVar23 = uVar23 ^ uVar19;
      uVar23 = uVar23 >> 0x15 | uVar23 << 0x2b;
      uVar11 = uVar3 ^ 0x800000000000808a ^ ~uVar13 & uVar23;
      uVar5 = uVar5 ^ uVar15;
      uVar27 = uVar5 >> 0x2b | uVar5 << 0x15;
      uVar26 = uVar26 ^ uVar30;
      uVar26 = uVar26 >> 0x32 | uVar26 << 0xe;
      uVar21 = ~uVar27 & uVar26 ^ uVar23;
      uVar1 = ~uVar26 & uVar3 ^ uVar27;
      uVar10 = ~uVar23 & uVar27 ^ uVar13;
      uVar26 = ~uVar3 & uVar13 ^ uVar26;
      uVar12 = uVar12 ^ uVar15;
      uVar12 = uVar12 >> 0x24 | uVar12 << 0x1c;
      uVar2 = uVar2 ^ uVar30;
      uVar4 = uVar2 >> 0x2c | uVar2 << 0x14;
      uVar39 = uVar39 ^ uVar29;
      uVar3 = uVar39 >> 0x3d | uVar39 << 3;
      uVar25 = uVar25 ^ uVar34;
      uVar39 = uVar25 >> 0x13 | uVar25 << 0x2d;
      uVar8 = uVar8 ^ uVar19;
      uVar2 = uVar8 >> 3 | uVar8 << 0x3d;
      uVar13 = ~uVar2 & uVar12 ^ uVar39;
      uVar23 = ~uVar39 & uVar2 ^ uVar3;
      uVar27 = ~uVar4 & uVar3 ^ uVar12;
      uVar3 = ~uVar3 & uVar39 ^ uVar4;
      uVar2 = ~uVar12 & uVar4 ^ uVar2;
      uVar38 = uVar38 ^ uVar34;
      uVar12 = uVar38 >> 0x3f | uVar38 << 1;
      uVar18 = uVar18 ^ uVar19;
      uVar38 = uVar18 >> 0x3a | uVar18 << 6;
      uVar22 = uVar22 ^ uVar15;
      uVar25 = uVar22 >> 0x27 | uVar22 << 0x19;
      uVar6 = uVar6 ^ uVar30;
      uVar6 = uVar6 >> 0x38 | uVar6 << 8;
      uVar36 = uVar36 ^ uVar29;
      uVar22 = uVar36 >> 0x2e | uVar36 << 0x12;
      uVar39 = ~uVar22 & uVar12 ^ uVar6;
      uVar5 = ~uVar6 & uVar22 ^ uVar25;
      uVar8 = ~uVar38 & uVar25 ^ uVar12;
      uVar25 = ~uVar25 & uVar6 ^ uVar38;
      uVar22 = ~uVar12 & uVar38 ^ uVar22;
      uVar24 = uVar24 ^ uVar30;
      uVar12 = uVar24 >> 0x25 | uVar24 << 0x1b;
      uVar28 = uVar28 ^ uVar29;
      uVar38 = uVar28 >> 0x1c | uVar28 << 0x24;
      uVar7 = uVar7 ^ uVar34;
      uVar28 = uVar7 >> 0x36 | uVar7 << 10;
      uVar6 = ~uVar38 & uVar28 ^ uVar12;
      uVar32 = uVar32 ^ uVar19;
      uVar18 = uVar32 >> 0x31 | uVar32 << 0xf;
      uVar36 = ~uVar28 & uVar18 ^ uVar38;
      uVar9 = uVar9 ^ uVar15;
      uVar32 = uVar9 >> 8 | uVar9 << 0x38;
      uVar28 = ~uVar18 & uVar32 ^ uVar28;
      uVar18 = ~uVar32 & uVar12 ^ uVar18;
      uVar32 = ~uVar12 & uVar38 ^ uVar32;
      uVar19 = uVar19 ^ uVar31;
      uVar15 = uVar15 ^ uVar33;
      uVar30 = uVar30 ^ uVar17;
      uVar29 = uVar29 ^ uVar40;
      uVar34 = uVar34 ^ uVar14;
      uVar7 = uVar19 >> 2 | uVar19 << 0x3e;
      uVar17 = uVar15 >> 9 | uVar15 << 0x37;
      uVar24 = uVar30 >> 0x19 | uVar30 << 0x27;
      uVar38 = uVar29 >> 0x17 | uVar29 << 0x29;
      uVar9 = uVar34 >> 0x3e | uVar34 << 2;
      uVar12 = ~uVar9 & uVar7 ^ uVar38;
      uVar4 = ~uVar38 & uVar9 ^ uVar24;
      uVar33 = ~uVar17 & uVar24 ^ uVar7;
      uVar29 = ~uVar24 & uVar38 ^ uVar17;
      uVar9 = ~uVar7 & uVar17 ^ uVar9;
      uVar24 = uVar8 ^ uVar6 ^ uVar11 ^ uVar27 ^ uVar33;
      uVar30 = uVar25 ^ uVar36 ^ uVar10 ^ uVar3 ^ uVar29;
      uVar14 = uVar5 ^ uVar28 ^ uVar21 ^ uVar23 ^ uVar4;
      uVar7 = uVar39 ^ uVar18 ^ uVar1 ^ uVar13 ^ uVar12;
      uVar17 = uVar22 ^ uVar32 ^ uVar26 ^ uVar2 ^ uVar9;
      uVar38 = (uVar7 >> 0x3f | uVar7 << 1) ^ uVar30;
      uVar15 = (uVar30 >> 0x3f | uVar30 << 1) ^ uVar17;
      uVar31 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar14;
      uVar40 = (uVar14 >> 0x3f | uVar14 << 1) ^ uVar24;
      uVar7 = (uVar24 >> 0x3f | uVar24 << 1) ^ uVar7;
      uVar11 = uVar11 ^ uVar15;
      uVar3 = uVar3 ^ uVar40;
      uVar17 = uVar3 >> 0x14 | uVar3 << 0x2c;
      uVar5 = uVar5 ^ uVar38;
      uVar3 = uVar5 >> 0x15 | uVar5 << 0x2b;
      uVar19 = uVar11 ^ 0x8000000080008000 ^ ~uVar17 & uVar3;
      uVar18 = uVar18 ^ uVar31;
      uVar18 = uVar18 >> 0x2b | uVar18 << 0x15;
      uVar9 = uVar9 ^ uVar7;
      uVar24 = uVar9 >> 0x32 | uVar9 << 0xe;
      uVar30 = ~uVar18 & uVar24 ^ uVar3;
      uVar9 = ~uVar24 & uVar11 ^ uVar18;
      uVar18 = ~uVar3 & uVar18 ^ uVar17;
      uVar24 = ~uVar11 & uVar17 ^ uVar24;
      uVar1 = uVar1 ^ uVar31;
      uVar11 = uVar1 >> 0x24 | uVar1 << 0x1c;
      uVar2 = uVar2 ^ uVar7;
      uVar1 = uVar2 >> 0x2c | uVar2 << 0x14;
      uVar8 = uVar8 ^ uVar15;
      uVar2 = uVar8 >> 0x3d | uVar8 << 3;
      uVar36 = uVar36 ^ uVar40;
      uVar8 = uVar36 >> 0x13 | uVar36 << 0x2d;
      uVar4 = uVar4 ^ uVar38;
      uVar17 = uVar4 >> 3 | uVar4 << 0x3d;
      uVar5 = ~uVar17 & uVar11 ^ uVar8;
      uVar3 = ~uVar8 & uVar17 ^ uVar2;
      uVar36 = ~uVar1 & uVar2 ^ uVar11;
      uVar2 = ~uVar2 & uVar8 ^ uVar1;
      uVar17 = ~uVar11 & uVar1 ^ uVar17;
      uVar10 = uVar10 ^ uVar40;
      uVar11 = uVar10 >> 0x3f | uVar10 << 1;
      uVar23 = uVar23 ^ uVar38;
      uVar1 = uVar23 >> 0x3a | uVar23 << 6;
      uVar39 = uVar39 ^ uVar31;
      uVar39 = uVar39 >> 0x27 | uVar39 << 0x19;
      uVar32 = uVar32 ^ uVar7;
      uVar10 = uVar32 >> 0x38 | uVar32 << 8;
      uVar33 = uVar33 ^ uVar15;
      uVar23 = uVar33 >> 0x2e | uVar33 << 0x12;
      uVar8 = ~uVar23 & uVar11 ^ uVar10;
      uVar32 = ~uVar10 & uVar23 ^ uVar39;
      uVar4 = ~uVar1 & uVar39 ^ uVar11;
      uVar39 = ~uVar39 & uVar10 ^ uVar1;
      uVar23 = ~uVar11 & uVar1 ^ uVar23;
      uVar26 = uVar26 ^ uVar7;
      uVar26 = uVar26 >> 0x25 | uVar26 << 0x1b;
      uVar27 = uVar27 ^ uVar15;
      uVar1 = uVar27 >> 0x1c | uVar27 << 0x24;
      uVar25 = uVar25 ^ uVar40;
      uVar27 = uVar25 >> 0x36 | uVar25 << 10;
      uVar14 = ~uVar1 & uVar27 ^ uVar26;
      uVar28 = uVar28 ^ uVar38;
      uVar33 = uVar28 >> 0x31 | uVar28 << 0xf;
      uVar28 = ~uVar27 & uVar33 ^ uVar1;
      uVar12 = uVar12 ^ uVar31;
      uVar11 = uVar12 >> 8 | uVar12 << 0x38;
      uVar27 = ~uVar33 & uVar11 ^ uVar27;
      uVar33 = ~uVar11 & uVar26 ^ uVar33;
      uVar11 = ~uVar26 & uVar1 ^ uVar11;
      uVar38 = uVar38 ^ uVar21;
      uVar31 = uVar31 ^ uVar13;
      uVar7 = uVar7 ^ uVar22;
      uVar15 = uVar15 ^ uVar6;
      uVar40 = uVar40 ^ uVar29;
      uVar26 = uVar38 >> 2 | uVar38 << 0x3e;
      uVar21 = uVar31 >> 9 | uVar31 << 0x37;
      uVar22 = uVar7 >> 0x19 | uVar7 << 0x27;
      uVar13 = uVar15 >> 0x17 | uVar15 << 0x29;
      uVar6 = uVar40 >> 0x3e | uVar40 << 2;
      uVar25 = ~uVar6 & uVar26 ^ uVar13;
      uVar38 = ~uVar13 & uVar6 ^ uVar22;
      uVar15 = ~uVar21 & uVar22 ^ uVar26;
      uVar31 = ~uVar22 & uVar13 ^ uVar21;
      uVar6 = ~uVar26 & uVar21 ^ uVar6;
      uVar26 = uVar4 ^ uVar14 ^ uVar19 ^ uVar36 ^ uVar15;
      uVar21 = uVar39 ^ uVar28 ^ uVar18 ^ uVar2 ^ uVar31;
      uVar13 = uVar32 ^ uVar27 ^ uVar30 ^ uVar3 ^ uVar38;
      uVar1 = uVar8 ^ uVar33 ^ uVar9 ^ uVar5 ^ uVar25;
      uVar22 = uVar23 ^ uVar11 ^ uVar24 ^ uVar17 ^ uVar6;
      uVar29 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar21;
      uVar21 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar22;
      uVar34 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar13;
      uVar40 = (uVar13 >> 0x3f | uVar13 << 1) ^ uVar26;
      uVar1 = (uVar26 >> 0x3f | uVar26 << 1) ^ uVar1;
      uVar19 = uVar19 ^ uVar21;
      uVar2 = uVar2 ^ uVar40;
      uVar26 = uVar2 >> 0x14 | uVar2 << 0x2c;
      uVar32 = uVar32 ^ uVar29;
      uVar10 = uVar32 >> 0x15 | uVar32 << 0x2b;
      uVar33 = uVar33 ^ uVar34;
      uVar13 = uVar33 >> 0x2b | uVar33 << 0x15;
      uVar6 = uVar6 ^ uVar1;
      uVar6 = uVar6 >> 0x32 | uVar6 << 0xe;
      uVar2 = ~uVar6 & uVar19 ^ uVar13;
      uVar7 = ~uVar13 & uVar6 ^ uVar10;
      uVar22 = ~uVar10 & uVar13 ^ uVar26;
      uVar6 = ~uVar19 & uVar26 ^ uVar6;
      uVar9 = uVar9 ^ uVar34;
      uVar13 = uVar9 >> 0x24 | uVar9 << 0x1c;
      uVar17 = uVar17 ^ uVar1;
      uVar9 = uVar17 >> 0x2c | uVar17 << 0x14;
      uVar4 = uVar4 ^ uVar21;
      uVar12 = uVar4 >> 0x3d | uVar4 << 3;
      uVar28 = uVar28 ^ uVar40;
      uVar33 = uVar28 >> 0x13 | uVar28 << 0x2d;
      uVar38 = uVar38 ^ uVar29;
      uVar17 = uVar38 >> 3 | uVar38 << 0x3d;
      uVar4 = ~uVar17 & uVar13 ^ uVar33;
      uVar28 = ~uVar33 & uVar17 ^ uVar12;
      uVar32 = ~uVar9 & uVar12 ^ uVar13;
      uVar38 = ~uVar12 & uVar33 ^ uVar9;
      uVar17 = ~uVar13 & uVar9 ^ uVar17;
      uVar18 = uVar18 ^ uVar40;
      uVar13 = uVar18 >> 0x3f | uVar18 << 1;
      uVar3 = uVar3 ^ uVar29;
      uVar12 = uVar3 >> 0x3a | uVar3 << 6;
      uVar8 = uVar8 ^ uVar34;
      uVar9 = uVar8 >> 0x27 | uVar8 << 0x19;
      uVar11 = uVar11 ^ uVar1;
      uVar33 = uVar11 >> 0x38 | uVar11 << 8;
      uVar15 = uVar15 ^ uVar21;
      uVar11 = uVar15 >> 0x2e | uVar15 << 0x12;
      uVar8 = ~uVar11 & uVar13 ^ uVar33;
      uVar18 = ~uVar33 & uVar11 ^ uVar9;
      uVar3 = ~uVar12 & uVar9 ^ uVar13;
      uVar9 = ~uVar9 & uVar33 ^ uVar12;
      uVar11 = ~uVar13 & uVar12 ^ uVar11;
      uVar36 = uVar36 ^ uVar21;
      uVar36 = uVar36 >> 0x1c | uVar36 << 0x24;
      uVar39 = uVar39 ^ uVar40;
      uVar39 = uVar39 >> 0x36 | uVar39 << 10;
      uVar27 = uVar27 ^ uVar29;
      uVar33 = uVar27 >> 0x31 | uVar27 << 0xf;
      uVar13 = ~uVar39 & uVar33 ^ uVar36;
      uVar25 = uVar25 ^ uVar34;
      uVar12 = uVar25 >> 8 | uVar25 << 0x38;
      uVar27 = ~uVar33 & uVar12 ^ uVar39;
      uVar24 = uVar24 ^ uVar1;
      uVar25 = uVar24 >> 0x25 | uVar24 << 0x1b;
      uVar33 = ~uVar12 & uVar25 ^ uVar33;
      uVar15 = ~uVar36 & uVar39 ^ uVar25;
      uVar12 = ~uVar25 & uVar36 ^ uVar12;
      uVar29 = uVar29 ^ uVar30;
      uVar34 = uVar34 ^ uVar5;
      uVar1 = uVar1 ^ uVar23;
      uVar21 = uVar21 ^ uVar14;
      uVar40 = uVar40 ^ uVar31;
      uVar5 = ~uVar26 & uVar10 ^ uVar19 ^ 0x808b;
      uVar36 = uVar29 >> 2 | uVar29 << 0x3e;
      uVar10 = uVar34 >> 9 | uVar34 << 0x37;
      uVar25 = uVar1 >> 0x19 | uVar1 << 0x27;
      uVar24 = ~uVar10 & uVar25 ^ uVar36;
      uVar39 = uVar15 ^ uVar24 ^ uVar32 ^ uVar3 ^ uVar5;
      uVar21 = uVar21 >> 0x17 | uVar21 << 0x29;
      uVar26 = uVar40 >> 0x3e | uVar40 << 2;
      uVar31 = ~uVar21 & uVar26 ^ uVar25;
      uVar23 = ~uVar26 & uVar36 ^ uVar21;
      uVar19 = ~uVar25 & uVar21 ^ uVar10;
      uVar26 = ~uVar36 & uVar10 ^ uVar26;
      uVar25 = uVar9 ^ uVar13 ^ uVar22 ^ uVar38 ^ uVar19;
      uVar36 = uVar18 ^ uVar27 ^ uVar7 ^ uVar28 ^ uVar31;
      uVar40 = uVar8 ^ uVar33 ^ uVar2 ^ uVar4 ^ uVar23;
      uVar21 = uVar11 ^ uVar12 ^ uVar6 ^ uVar17 ^ uVar26;
      uVar10 = (uVar40 >> 0x3f | uVar40 << 1) ^ uVar25;
      uVar14 = (uVar25 >> 0x3f | uVar25 << 1) ^ uVar21;
      uVar34 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar36;
      uVar37 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar39;
      uVar40 = (uVar39 >> 0x3f | uVar39 << 1) ^ uVar40;
      uVar5 = uVar5 ^ uVar14;
      uVar38 = uVar38 ^ uVar37;
      uVar36 = uVar38 >> 0x14 | uVar38 << 0x2c;
      uVar18 = uVar18 ^ uVar10;
      uVar1 = uVar18 >> 0x15 | uVar18 << 0x2b;
      uVar39 = uVar5 ^ 0x80000001 ^ ~uVar36 & uVar1;
      uVar33 = uVar33 ^ uVar34;
      uVar25 = uVar33 >> 0x2b | uVar33 << 0x15;
      uVar26 = uVar26 ^ uVar40;
      uVar21 = uVar26 >> 0x32 | uVar26 << 0xe;
      uVar30 = ~uVar25 & uVar21 ^ uVar1;
      uVar38 = ~uVar1 & uVar25 ^ uVar36;
      uVar25 = ~uVar21 & uVar5 ^ uVar25;
      uVar21 = ~uVar5 & uVar36 ^ uVar21;
      uVar2 = uVar2 ^ uVar34;
      uVar26 = uVar2 >> 0x24 | uVar2 << 0x1c;
      uVar17 = uVar17 ^ uVar40;
      uVar17 = uVar17 >> 0x2c | uVar17 << 0x14;
      uVar3 = uVar3 ^ uVar14;
      uVar36 = uVar3 >> 0x3d | uVar3 << 3;
      uVar13 = uVar13 ^ uVar37;
      uVar13 = uVar13 >> 0x13 | uVar13 << 0x2d;
      uVar31 = uVar31 ^ uVar10;
      uVar2 = uVar31 >> 3 | uVar31 << 0x3d;
      uVar5 = ~uVar2 & uVar26 ^ uVar13;
      uVar31 = ~uVar13 & uVar2 ^ uVar36;
      uVar18 = ~uVar17 & uVar36 ^ uVar26;
      uVar3 = ~uVar36 & uVar13 ^ uVar17;
      uVar2 = ~uVar26 & uVar17 ^ uVar2;
      uVar22 = uVar22 ^ uVar37;
      uVar26 = uVar22 >> 0x3f | uVar22 << 1;
      uVar28 = uVar28 ^ uVar10;
      uVar17 = uVar28 >> 0x3a | uVar28 << 6;
      uVar8 = uVar8 ^ uVar34;
      uVar1 = uVar8 >> 0x27 | uVar8 << 0x19;
      uVar12 = uVar12 ^ uVar40;
      uVar12 = uVar12 >> 0x38 | uVar12 << 8;
      uVar24 = uVar24 ^ uVar14;
      uVar13 = uVar24 >> 0x2e | uVar24 << 0x12;
      uVar36 = ~uVar13 & uVar26 ^ uVar12;
      uVar29 = ~uVar12 & uVar13 ^ uVar1;
      uVar22 = ~uVar17 & uVar1 ^ uVar26;
      uVar8 = ~uVar1 & uVar12 ^ uVar17;
      uVar13 = ~uVar26 & uVar17 ^ uVar13;
      uVar6 = uVar6 ^ uVar40;
      uVar17 = uVar6 >> 0x25 | uVar6 << 0x1b;
      uVar32 = uVar32 ^ uVar14;
      uVar1 = uVar32 >> 0x1c | uVar32 << 0x24;
      uVar9 = uVar9 ^ uVar37;
      uVar12 = uVar9 >> 0x36 | uVar9 << 10;
      uVar26 = ~uVar1 & uVar12 ^ uVar17;
      uVar27 = uVar27 ^ uVar10;
      uVar32 = uVar27 >> 0x31 | uVar27 << 0xf;
      uVar27 = ~uVar12 & uVar32 ^ uVar1;
      uVar23 = uVar23 ^ uVar34;
      uVar6 = uVar23 >> 8 | uVar23 << 0x38;
      uVar12 = ~uVar32 & uVar6 ^ uVar12;
      uVar32 = ~uVar6 & uVar17 ^ uVar32;
      uVar6 = ~uVar17 & uVar1 ^ uVar6;
      uVar10 = uVar10 ^ uVar7;
      uVar34 = uVar34 ^ uVar4;
      uVar40 = uVar40 ^ uVar11;
      uVar14 = uVar14 ^ uVar15;
      uVar37 = uVar37 ^ uVar19;
      uVar11 = uVar10 >> 2 | uVar10 << 0x3e;
      uVar17 = uVar34 >> 9 | uVar34 << 0x37;
      uVar23 = uVar40 >> 0x19 | uVar40 << 0x27;
      uVar9 = uVar14 >> 0x17 | uVar14 << 0x29;
      uVar14 = uVar37 >> 0x3e | uVar37 << 2;
      uVar7 = ~uVar14 & uVar11 ^ uVar9;
      uVar10 = ~uVar9 & uVar14 ^ uVar23;
      uVar4 = ~uVar17 & uVar23 ^ uVar11;
      uVar19 = ~uVar23 & uVar9 ^ uVar17;
      uVar14 = ~uVar11 & uVar17 ^ uVar14;
      uVar23 = uVar22 ^ uVar26 ^ uVar39 ^ uVar18 ^ uVar4;
      uVar9 = uVar8 ^ uVar27 ^ uVar38 ^ uVar3 ^ uVar19;
      uVar17 = uVar29 ^ uVar12 ^ uVar30 ^ uVar31 ^ uVar10;
      uVar24 = uVar36 ^ uVar32 ^ uVar25 ^ uVar5 ^ uVar7;
      uVar11 = uVar13 ^ uVar6 ^ uVar21 ^ uVar2 ^ uVar14;
      uVar28 = (uVar24 >> 0x3f | uVar24 << 1) ^ uVar9;
      uVar1 = (uVar9 >> 0x3f | uVar9 << 1) ^ uVar11;
      uVar33 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar17;
      uVar9 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar23;
      uVar24 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar24;
      uVar39 = uVar39 ^ uVar1;
      uVar3 = uVar3 ^ uVar9;
      uVar3 = uVar3 >> 0x14 | uVar3 << 0x2c;
      uVar29 = uVar29 ^ uVar28;
      uVar17 = uVar29 >> 0x15 | uVar29 << 0x2b;
      uVar15 = uVar39 ^ 0x8000000080008081 ^ ~uVar3 & uVar17;
      uVar32 = uVar32 ^ uVar33;
      uVar23 = uVar32 >> 0x2b | uVar32 << 0x15;
      uVar14 = uVar14 ^ uVar24;
      uVar32 = uVar14 >> 0x32 | uVar14 << 0xe;
      uVar11 = ~uVar23 & uVar32 ^ uVar17;
      uVar17 = ~uVar17 & uVar23 ^ uVar3;
      uVar23 = ~uVar32 & uVar39 ^ uVar23;
      uVar32 = ~uVar39 & uVar3 ^ uVar32;
      uVar25 = uVar25 ^ uVar33;
      uVar39 = uVar25 >> 0x24 | uVar25 << 0x1c;
      uVar2 = uVar2 ^ uVar24;
      uVar25 = uVar2 >> 0x2c | uVar2 << 0x14;
      uVar22 = uVar22 ^ uVar1;
      uVar3 = uVar22 >> 0x3d | uVar22 << 3;
      uVar27 = uVar27 ^ uVar9;
      uVar14 = uVar27 >> 0x13 | uVar27 << 0x2d;
      uVar10 = uVar10 ^ uVar28;
      uVar2 = uVar10 >> 3 | uVar10 << 0x3d;
      uVar37 = ~uVar2 & uVar39 ^ uVar14;
      uVar27 = ~uVar14 & uVar2 ^ uVar3;
      uVar22 = ~uVar25 & uVar3 ^ uVar39;
      uVar10 = ~uVar3 & uVar14 ^ uVar25;
      uVar2 = ~uVar39 & uVar25 ^ uVar2;
      uVar38 = uVar38 ^ uVar9;
      uVar38 = uVar38 >> 0x3f | uVar38 << 1;
      uVar31 = uVar31 ^ uVar28;
      uVar3 = uVar31 >> 0x3a | uVar31 << 6;
      uVar36 = uVar36 ^ uVar33;
      uVar36 = uVar36 >> 0x27 | uVar36 << 0x19;
      uVar6 = uVar6 ^ uVar24;
      uVar6 = uVar6 >> 0x38 | uVar6 << 8;
      uVar4 = uVar4 ^ uVar1;
      uVar14 = uVar4 >> 0x2e | uVar4 << 0x12;
      uVar39 = ~uVar14 & uVar38 ^ uVar6;
      uVar4 = ~uVar6 & uVar14 ^ uVar36;
      uVar25 = ~uVar3 & uVar36 ^ uVar38;
      uVar6 = ~uVar36 & uVar6 ^ uVar3;
      uVar14 = ~uVar38 & uVar3 ^ uVar14;
      uVar21 = uVar21 ^ uVar24;
      uVar21 = uVar21 >> 0x25 | uVar21 << 0x1b;
      uVar18 = uVar18 ^ uVar1;
      uVar38 = uVar18 >> 0x1c | uVar18 << 0x24;
      uVar8 = uVar8 ^ uVar9;
      uVar36 = uVar8 >> 0x36 | uVar8 << 10;
      uVar34 = ~uVar38 & uVar36 ^ uVar21;
      uVar12 = uVar12 ^ uVar28;
      uVar3 = uVar12 >> 0x31 | uVar12 << 0xf;
      uVar31 = ~uVar36 & uVar3 ^ uVar38;
      uVar7 = uVar7 ^ uVar33;
      uVar12 = uVar7 >> 8 | uVar7 << 0x38;
      uVar36 = ~uVar3 & uVar12 ^ uVar36;
      uVar3 = ~uVar12 & uVar21 ^ uVar3;
      uVar12 = ~uVar21 & uVar38 ^ uVar12;
      uVar28 = uVar28 ^ uVar30;
      uVar33 = uVar33 ^ uVar5;
      uVar24 = uVar24 ^ uVar13;
      uVar1 = uVar1 ^ uVar26;
      uVar9 = uVar9 ^ uVar19;
      uVar18 = uVar28 >> 2 | uVar28 << 0x3e;
      uVar28 = uVar33 >> 9 | uVar33 << 0x37;
      uVar21 = uVar24 >> 0x19 | uVar24 << 0x27;
      uVar13 = uVar1 >> 0x17 | uVar1 << 0x29;
      uVar9 = uVar9 >> 0x3e | uVar9 << 2;
      uVar24 = ~uVar9 & uVar18 ^ uVar13;
      uVar7 = ~uVar13 & uVar9 ^ uVar21;
      uVar26 = ~uVar28 & uVar21 ^ uVar18;
      uVar38 = ~uVar21 & uVar13 ^ uVar28;
      uVar9 = ~uVar18 & uVar28 ^ uVar9;
      uVar30 = uVar25 ^ uVar34 ^ uVar15 ^ uVar22 ^ uVar26;
      uVar13 = uVar6 ^ uVar31 ^ uVar17 ^ uVar10 ^ uVar38;
      uVar1 = uVar4 ^ uVar36 ^ uVar11 ^ uVar27 ^ uVar7;
      uVar8 = uVar39 ^ uVar3 ^ uVar23 ^ uVar37 ^ uVar24;
      uVar21 = uVar14 ^ uVar12 ^ uVar32 ^ uVar2 ^ uVar9;
      uVar28 = (uVar8 >> 0x3f | uVar8 << 1) ^ uVar13;
      uVar18 = (uVar13 >> 0x3f | uVar13 << 1) ^ uVar21;
      uVar35 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar1;
      uVar33 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar30;
      uVar8 = (uVar30 >> 0x3f | uVar30 << 1) ^ uVar8;
      uVar15 = uVar15 ^ uVar18;
      uVar10 = uVar10 ^ uVar33;
      uVar30 = uVar10 >> 0x14 | uVar10 << 0x2c;
      uVar4 = uVar4 ^ uVar28;
      uVar13 = uVar4 >> 0x15 | uVar4 << 0x2b;
      uVar19 = uVar15 ^ 0x8000000000008009 ^ ~uVar30 & uVar13;
      uVar3 = uVar3 ^ uVar35;
      uVar21 = uVar3 >> 0x2b | uVar3 << 0x15;
      uVar9 = uVar9 ^ uVar8;
      uVar10 = uVar9 >> 0x32 | uVar9 << 0xe;
      uVar40 = ~uVar21 & uVar10 ^ uVar13;
      uVar9 = ~uVar10 & uVar15 ^ uVar21;
      uVar1 = ~uVar13 & uVar21 ^ uVar30;
      uVar10 = ~uVar15 & uVar30 ^ uVar10;
      uVar23 = uVar23 ^ uVar35;
      uVar13 = uVar23 >> 0x24 | uVar23 << 0x1c;
      uVar2 = uVar2 ^ uVar8;
      uVar2 = uVar2 >> 0x2c | uVar2 << 0x14;
      uVar25 = uVar25 ^ uVar18;
      uVar21 = uVar25 >> 0x3d | uVar25 << 3;
      uVar31 = uVar31 ^ uVar33;
      uVar23 = uVar31 >> 0x13 | uVar31 << 0x2d;
      uVar7 = uVar7 ^ uVar28;
      uVar7 = uVar7 >> 3 | uVar7 << 0x3d;
      uVar29 = ~uVar7 & uVar13 ^ uVar23;
      uVar3 = ~uVar23 & uVar7 ^ uVar21;
      uVar4 = ~uVar2 & uVar21 ^ uVar13;
      uVar23 = ~uVar21 & uVar23 ^ uVar2;
      uVar7 = ~uVar13 & uVar2 ^ uVar7;
      uVar17 = uVar17 ^ uVar33;
      uVar17 = uVar17 >> 0x3f | uVar17 << 1;
      uVar27 = uVar27 ^ uVar28;
      uVar13 = uVar27 >> 0x3a | uVar27 << 6;
      uVar39 = uVar39 ^ uVar35;
      uVar39 = uVar39 >> 0x27 | uVar39 << 0x19;
      uVar12 = uVar12 ^ uVar8;
      uVar25 = uVar12 >> 0x38 | uVar12 << 8;
      uVar26 = uVar26 ^ uVar18;
      uVar21 = uVar26 >> 0x2e | uVar26 << 0x12;
      uVar30 = ~uVar21 & uVar17 ^ uVar25;
      uVar2 = ~uVar25 & uVar21 ^ uVar39;
      uVar27 = ~uVar13 & uVar39 ^ uVar17;
      uVar5 = ~uVar39 & uVar25 ^ uVar13;
      uVar21 = ~uVar17 & uVar13 ^ uVar21;
      uVar32 = uVar32 ^ uVar8;
      uVar25 = uVar32 >> 0x25 | uVar32 << 0x1b;
      uVar22 = uVar22 ^ uVar18;
      uVar39 = uVar22 >> 0x1c | uVar22 << 0x24;
      uVar6 = uVar6 ^ uVar33;
      uVar31 = uVar6 >> 0x36 | uVar6 << 10;
      uVar26 = ~uVar39 & uVar31 ^ uVar25;
      uVar36 = uVar36 ^ uVar28;
      uVar13 = uVar36 >> 0x31 | uVar36 << 0xf;
      uVar17 = ~uVar31 & uVar13 ^ uVar39;
      uVar24 = uVar24 ^ uVar35;
      uVar22 = uVar24 >> 8 | uVar24 << 0x38;
      uVar31 = ~uVar13 & uVar22 ^ uVar31;
      uVar13 = ~uVar22 & uVar25 ^ uVar13;
      uVar22 = ~uVar25 & uVar39 ^ uVar22;
      uVar28 = uVar28 ^ uVar11;
      uVar35 = uVar35 ^ uVar37;
      uVar8 = uVar8 ^ uVar14;
      uVar18 = uVar18 ^ uVar34;
      uVar33 = uVar33 ^ uVar38;
      uVar36 = uVar28 >> 2 | uVar28 << 0x3e;
      uVar11 = uVar35 >> 9 | uVar35 << 0x37;
      uVar39 = uVar8 >> 0x19 | uVar8 << 0x27;
      uVar6 = uVar18 >> 0x17 | uVar18 << 0x29;
      uVar25 = uVar33 >> 0x3e | uVar33 << 2;
      uVar28 = ~uVar25 & uVar36 ^ uVar6;
      uVar38 = ~uVar6 & uVar25 ^ uVar39;
      uVar32 = ~uVar11 & uVar39 ^ uVar36;
      uVar33 = ~uVar39 & uVar6 ^ uVar11;
      uVar25 = ~uVar36 & uVar11 ^ uVar25;
      uVar36 = uVar27 ^ uVar26 ^ uVar19 ^ uVar4 ^ uVar32;
      uVar39 = uVar5 ^ uVar17 ^ uVar1 ^ uVar23 ^ uVar33;
      uVar6 = uVar2 ^ uVar31 ^ uVar40 ^ uVar3 ^ uVar38;
      uVar12 = uVar30 ^ uVar13 ^ uVar9 ^ uVar29 ^ uVar28;
      uVar11 = uVar21 ^ uVar22 ^ uVar10 ^ uVar7 ^ uVar25;
      uVar14 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar39;
      uVar34 = (uVar39 >> 0x3f | uVar39 << 1) ^ uVar11;
      uVar37 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar6;
      uVar35 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar36;
      uVar12 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar12;
      uVar19 = uVar19 ^ uVar34;
      uVar23 = uVar23 ^ uVar35;
      uVar11 = uVar23 >> 0x14 | uVar23 << 0x2c;
      uVar2 = uVar2 ^ uVar14;
      uVar6 = uVar2 >> 0x15 | uVar2 << 0x2b;
      uVar13 = uVar13 ^ uVar37;
      uVar13 = uVar13 >> 0x2b | uVar13 << 0x15;
      uVar25 = uVar25 ^ uVar12;
      uVar25 = uVar25 >> 0x32 | uVar25 << 0xe;
      uVar2 = ~uVar25 & uVar19 ^ uVar13;
      uVar8 = ~uVar13 & uVar25 ^ uVar6;
      uVar39 = ~uVar6 & uVar13 ^ uVar11;
      uVar25 = ~uVar19 & uVar11 ^ uVar25;
      uVar9 = uVar9 ^ uVar37;
      uVar13 = uVar9 >> 0x24 | uVar9 << 0x1c;
      uVar7 = uVar7 ^ uVar12;
      uVar23 = uVar7 >> 0x2c | uVar7 << 0x14;
      uVar27 = uVar27 ^ uVar34;
      uVar27 = uVar27 >> 0x3d | uVar27 << 3;
      uVar17 = uVar17 ^ uVar35;
      uVar36 = uVar17 >> 0x13 | uVar17 << 0x2d;
      uVar38 = uVar38 ^ uVar14;
      uVar17 = uVar38 >> 3 | uVar38 << 0x3d;
      uVar41 = ~uVar17 & uVar13 ^ uVar36;
      uVar38 = ~uVar36 & uVar17 ^ uVar27;
      uVar18 = ~uVar23 & uVar27 ^ uVar13;
      uVar27 = ~uVar27 & uVar36 ^ uVar23;
      uVar17 = ~uVar13 & uVar23 ^ uVar17;
      uVar1 = uVar1 ^ uVar35;
      uVar13 = uVar1 >> 0x3f | uVar1 << 1;
      uVar3 = uVar3 ^ uVar14;
      uVar36 = uVar3 >> 0x3a | uVar3 << 6;
      uVar30 = uVar30 ^ uVar37;
      uVar9 = uVar30 >> 0x27 | uVar30 << 0x19;
      uVar22 = uVar22 ^ uVar12;
      uVar22 = uVar22 >> 0x38 | uVar22 << 8;
      uVar32 = uVar32 ^ uVar34;
      uVar23 = uVar32 >> 0x2e | uVar32 << 0x12;
      uVar30 = ~uVar23 & uVar13 ^ uVar22;
      uVar32 = ~uVar22 & uVar23 ^ uVar9;
      uVar1 = ~uVar36 & uVar9 ^ uVar13;
      uVar24 = ~uVar9 & uVar22 ^ uVar36;
      uVar23 = ~uVar13 & uVar36 ^ uVar23;
      uVar4 = uVar4 ^ uVar34;
      uVar22 = uVar4 >> 0x1c | uVar4 << 0x24;
      uVar5 = uVar5 ^ uVar35;
      uVar36 = uVar5 >> 0x36 | uVar5 << 10;
      uVar31 = uVar31 ^ uVar14;
      uVar7 = uVar31 >> 0x31 | uVar31 << 0xf;
      uVar9 = ~uVar36 & uVar7 ^ uVar22;
      uVar28 = uVar28 ^ uVar37;
      uVar31 = uVar28 >> 8 | uVar28 << 0x38;
      uVar28 = ~uVar7 & uVar31 ^ uVar36;
      uVar10 = uVar10 ^ uVar12;
      uVar13 = uVar10 >> 0x25 | uVar10 << 0x1b;
      uVar7 = ~uVar31 & uVar13 ^ uVar7;
      uVar15 = ~uVar22 & uVar36 ^ uVar13;
      uVar31 = ~uVar13 & uVar22 ^ uVar31;
      uVar14 = uVar14 ^ uVar40;
      uVar37 = uVar37 ^ uVar29;
      uVar12 = uVar12 ^ uVar21;
      uVar34 = uVar34 ^ uVar26;
      uVar35 = uVar35 ^ uVar33;
      uVar42 = ~uVar11 & uVar6 ^ uVar19 ^ 0x8a;
      uVar21 = uVar14 >> 2 | uVar14 << 0x3e;
      uVar26 = uVar37 >> 9 | uVar37 << 0x37;
      uVar13 = uVar12 >> 0x19 | uVar12 << 0x27;
      uVar5 = ~uVar26 & uVar13 ^ uVar21;
      uVar6 = uVar15 ^ uVar5 ^ uVar18 ^ uVar1 ^ uVar42;
      uVar11 = uVar34 >> 0x17 | uVar34 << 0x29;
      uVar22 = uVar35 >> 0x3e | uVar35 << 2;
      uVar10 = ~uVar11 & uVar22 ^ uVar13;
      uVar19 = ~uVar22 & uVar21 ^ uVar11;
      uVar11 = ~uVar13 & uVar11 ^ uVar26;
      uVar22 = ~uVar21 & uVar26 ^ uVar22;
      uVar26 = uVar24 ^ uVar9 ^ uVar39 ^ uVar27 ^ uVar11;
      uVar36 = uVar32 ^ uVar28 ^ uVar8 ^ uVar38 ^ uVar10;
      uVar3 = uVar30 ^ uVar7 ^ uVar2 ^ uVar41 ^ uVar19;
      uVar13 = uVar23 ^ uVar31 ^ uVar25 ^ uVar17 ^ uVar22;
      uVar21 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar26;
      uVar26 = (uVar26 >> 0x3f | uVar26 << 1) ^ uVar13;
      uVar29 = (uVar13 >> 0x3f | uVar13 << 1) ^ uVar36;
      uVar33 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar6;
      uVar3 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar3;
      uVar42 = uVar42 ^ uVar26;
      uVar27 = uVar27 ^ uVar33;
      uVar13 = uVar27 >> 0x14 | uVar27 << 0x2c;
      uVar32 = uVar32 ^ uVar21;
      uVar12 = uVar32 >> 0x15 | uVar32 << 0x2b;
      uVar7 = uVar7 ^ uVar29;
      uVar27 = uVar7 >> 0x2b | uVar7 << 0x15;
      uVar22 = uVar22 ^ uVar3;
      uVar32 = uVar22 >> 0x32 | uVar22 << 0xe;
      uVar6 = ~uVar32 & uVar42 ^ uVar27;
      uVar4 = ~uVar27 & uVar32 ^ uVar12;
      uVar36 = ~uVar12 & uVar27 ^ uVar13;
      uVar32 = ~uVar42 & uVar13 ^ uVar32;
      uVar2 = uVar2 ^ uVar29;
      uVar27 = uVar2 >> 0x24 | uVar2 << 0x1c;
      uVar17 = uVar17 ^ uVar3;
      uVar2 = uVar17 >> 0x2c | uVar17 << 0x14;
      uVar1 = uVar1 ^ uVar26;
      uVar22 = uVar1 >> 0x3d | uVar1 << 3;
      uVar9 = uVar9 ^ uVar33;
      uVar1 = uVar9 >> 0x13 | uVar9 << 0x2d;
      uVar10 = uVar10 ^ uVar21;
      uVar17 = uVar10 >> 3 | uVar10 << 0x3d;
      uVar14 = ~uVar17 & uVar27 ^ uVar1;
      uVar7 = ~uVar1 & uVar17 ^ uVar22;
      uVar9 = ~uVar2 & uVar22 ^ uVar27;
      uVar22 = ~uVar22 & uVar1 ^ uVar2;
      uVar17 = ~uVar27 & uVar2 ^ uVar17;
      uVar39 = uVar39 ^ uVar33;
      uVar27 = uVar39 >> 0x3f | uVar39 << 1;
      uVar38 = uVar38 ^ uVar21;
      uVar10 = uVar38 >> 0x3a | uVar38 << 6;
      uVar30 = uVar30 ^ uVar29;
      uVar1 = uVar30 >> 0x27 | uVar30 << 0x19;
      uVar31 = uVar31 ^ uVar3;
      uVar38 = uVar31 >> 0x38 | uVar31 << 8;
      uVar5 = uVar5 ^ uVar26;
      uVar2 = uVar5 >> 0x2e | uVar5 << 0x12;
      uVar5 = ~uVar2 & uVar27 ^ uVar38;
      uVar39 = ~uVar38 & uVar2 ^ uVar1;
      uVar30 = ~uVar10 & uVar1 ^ uVar27;
      uVar1 = ~uVar1 & uVar38 ^ uVar10;
      uVar2 = ~uVar27 & uVar10 ^ uVar2;
      uVar18 = uVar18 ^ uVar26;
      uVar38 = uVar18 >> 0x1c | uVar18 << 0x24;
      uVar24 = uVar24 ^ uVar33;
      uVar31 = uVar24 >> 0x36 | uVar24 << 10;
      uVar28 = uVar28 ^ uVar21;
      uVar18 = uVar28 >> 0x31 | uVar28 << 0xf;
      uVar24 = ~uVar31 & uVar18 ^ uVar38;
      uVar19 = uVar19 ^ uVar29;
      uVar40 = uVar19 >> 8 | uVar19 << 0x38;
      uVar10 = ~uVar18 & uVar40 ^ uVar31;
      uVar25 = uVar25 ^ uVar3;
      uVar27 = uVar25 >> 0x25 | uVar25 << 0x1b;
      uVar18 = ~uVar40 & uVar27 ^ uVar18;
      uVar19 = ~uVar38 & uVar31 ^ uVar27;
      uVar40 = ~uVar27 & uVar38 ^ uVar40;
      uVar21 = uVar21 ^ uVar8;
      uVar29 = uVar29 ^ uVar41;
      uVar3 = uVar3 ^ uVar23;
      uVar26 = uVar26 ^ uVar15;
      uVar33 = uVar33 ^ uVar11;
      uVar38 = ~uVar13 & uVar12 ^ uVar42 ^ 0x88;
      uVar21 = uVar21 >> 2 | uVar21 << 0x3e;
      uVar25 = uVar29 >> 9 | uVar29 << 0x37;
      uVar28 = uVar3 >> 0x19 | uVar3 << 0x27;
      uVar15 = ~uVar25 & uVar28 ^ uVar21;
      uVar13 = uVar19 ^ uVar15 ^ uVar9 ^ uVar30 ^ uVar38;
      uVar11 = uVar26 >> 0x17 | uVar26 << 0x29;
      uVar27 = uVar33 >> 0x3e | uVar33 << 2;
      uVar12 = ~uVar11 & uVar27 ^ uVar28;
      uVar23 = ~uVar27 & uVar21 ^ uVar11;
      uVar8 = ~uVar28 & uVar11 ^ uVar25;
      uVar27 = ~uVar21 & uVar25 ^ uVar27;
      uVar11 = uVar1 ^ uVar24 ^ uVar36 ^ uVar22 ^ uVar8;
      uVar26 = uVar39 ^ uVar10 ^ uVar4 ^ uVar7 ^ uVar12;
      uVar29 = uVar5 ^ uVar18 ^ uVar6 ^ uVar14 ^ uVar23;
      uVar21 = uVar2 ^ uVar40 ^ uVar32 ^ uVar17 ^ uVar27;
      uVar28 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar11;
      uVar34 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar21;
      uVar37 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar26;
      uVar35 = (uVar26 >> 0x3f | uVar26 << 1) ^ uVar13;
      uVar29 = (uVar13 >> 0x3f | uVar13 << 1) ^ uVar29;
      uVar38 = uVar38 ^ uVar34;
      uVar22 = uVar22 ^ uVar35;
      uVar26 = uVar22 >> 0x14 | uVar22 << 0x2c;
      uVar39 = uVar39 ^ uVar28;
      uVar11 = uVar39 >> 0x15 | uVar39 << 0x2b;
      uVar3 = uVar38 ^ 0x80008009 ^ ~uVar26 & uVar11;
      uVar18 = uVar18 ^ uVar37;
      uVar13 = uVar18 >> 0x2b | uVar18 << 0x15;
      uVar27 = uVar27 ^ uVar29;
      uVar21 = uVar27 >> 0x32 | uVar27 << 0xe;
      uVar31 = ~uVar13 & uVar21 ^ uVar11;
      uVar25 = ~uVar21 & uVar38 ^ uVar13;
      uVar22 = ~uVar11 & uVar13 ^ uVar26;
      uVar21 = ~uVar38 & uVar26 ^ uVar21;
      uVar6 = uVar6 ^ uVar37;
      uVar11 = uVar6 >> 0x24 | uVar6 << 0x1c;
      uVar17 = uVar17 ^ uVar29;
      uVar13 = uVar17 >> 0x2c | uVar17 << 0x14;
      uVar30 = uVar30 ^ uVar34;
      uVar17 = uVar30 >> 0x3d | uVar30 << 3;
      uVar24 = uVar24 ^ uVar35;
      uVar27 = uVar24 >> 0x13 | uVar24 << 0x2d;
      uVar12 = uVar12 ^ uVar28;
      uVar26 = uVar12 >> 3 | uVar12 << 0x3d;
      uVar33 = ~uVar26 & uVar11 ^ uVar27;
      uVar12 = ~uVar27 & uVar26 ^ uVar17;
      uVar38 = ~uVar13 & uVar17 ^ uVar11;
      uVar39 = ~uVar17 & uVar27 ^ uVar13;
      uVar26 = ~uVar11 & uVar13 ^ uVar26;
      uVar36 = uVar36 ^ uVar35;
      uVar11 = uVar36 >> 0x3f | uVar36 << 1;
      uVar7 = uVar7 ^ uVar28;
      uVar17 = uVar7 >> 0x3a | uVar7 << 6;
      uVar5 = uVar5 ^ uVar37;
      uVar27 = uVar5 >> 0x27 | uVar5 << 0x19;
      uVar40 = uVar40 ^ uVar29;
      uVar6 = uVar40 >> 0x38 | uVar40 << 8;
      uVar15 = uVar15 ^ uVar34;
      uVar13 = uVar15 >> 0x2e | uVar15 << 0x12;
      uVar7 = ~uVar13 & uVar11 ^ uVar6;
      uVar15 = ~uVar6 & uVar13 ^ uVar27;
      uVar24 = ~uVar17 & uVar27 ^ uVar11;
      uVar18 = ~uVar27 & uVar6 ^ uVar17;
      uVar13 = ~uVar11 & uVar17 ^ uVar13;
      uVar32 = uVar32 ^ uVar29;
      uVar27 = uVar32 >> 0x25 | uVar32 << 0x1b;
      uVar9 = uVar9 ^ uVar34;
      uVar6 = uVar9 >> 0x1c | uVar9 << 0x24;
      uVar1 = uVar1 ^ uVar35;
      uVar1 = uVar1 >> 0x36 | uVar1 << 10;
      uVar11 = ~uVar6 & uVar1 ^ uVar27;
      uVar10 = uVar10 ^ uVar28;
      uVar36 = uVar10 >> 0x31 | uVar10 << 0xf;
      uVar17 = ~uVar1 & uVar36 ^ uVar6;
      uVar23 = uVar23 ^ uVar37;
      uVar23 = uVar23 >> 8 | uVar23 << 0x38;
      uVar1 = ~uVar36 & uVar23 ^ uVar1;
      uVar36 = ~uVar23 & uVar27 ^ uVar36;
      uVar23 = ~uVar27 & uVar6 ^ uVar23;
      uVar28 = uVar28 ^ uVar4;
      uVar37 = uVar37 ^ uVar14;
      uVar29 = uVar29 ^ uVar2;
      uVar34 = uVar34 ^ uVar19;
      uVar35 = uVar35 ^ uVar8;
      uVar32 = uVar28 >> 2 | uVar28 << 0x3e;
      uVar27 = uVar37 >> 9 | uVar37 << 0x37;
      uVar6 = uVar29 >> 0x19 | uVar29 << 0x27;
      uVar9 = uVar34 >> 0x17 | uVar34 << 0x29;
      uVar8 = uVar35 >> 0x3e | uVar35 << 2;
      uVar2 = ~uVar8 & uVar32 ^ uVar9;
      uVar5 = ~uVar9 & uVar8 ^ uVar6;
      uVar4 = ~uVar27 & uVar6 ^ uVar32;
      uVar30 = ~uVar6 & uVar9 ^ uVar27;
      uVar8 = ~uVar32 & uVar27 ^ uVar8;
      uVar6 = uVar24 ^ uVar11 ^ uVar3 ^ uVar38 ^ uVar4;
      uVar9 = uVar18 ^ uVar17 ^ uVar22 ^ uVar39 ^ uVar30;
      uVar28 = uVar15 ^ uVar1 ^ uVar31 ^ uVar12 ^ uVar5;
      uVar32 = uVar7 ^ uVar36 ^ uVar25 ^ uVar33 ^ uVar2;
      uVar27 = uVar13 ^ uVar23 ^ uVar21 ^ uVar26 ^ uVar8;
      uVar14 = (uVar32 >> 0x3f | uVar32 << 1) ^ uVar9;
      uVar10 = (uVar9 >> 0x3f | uVar9 << 1) ^ uVar27;
      uVar29 = (uVar27 >> 0x3f | uVar27 << 1) ^ uVar28;
      uVar19 = (uVar28 >> 0x3f | uVar28 << 1) ^ uVar6;
      uVar32 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar32;
      uVar3 = uVar3 ^ uVar10;
      uVar39 = uVar39 ^ uVar19;
      uVar27 = uVar39 >> 0x14 | uVar39 << 0x2c;
      uVar15 = uVar15 ^ uVar14;
      uVar6 = uVar15 >> 0x15 | uVar15 << 0x2b;
      uVar15 = uVar3 ^ 0x8000000a ^ ~uVar27 & uVar6;
      uVar36 = uVar36 ^ uVar29;
      uVar9 = uVar36 >> 0x2b | uVar36 << 0x15;
      uVar8 = uVar8 ^ uVar32;
      uVar36 = uVar8 >> 0x32 | uVar8 << 0xe;
      uVar8 = ~uVar9 & uVar36 ^ uVar6;
      uVar39 = ~uVar36 & uVar3 ^ uVar9;
      uVar6 = ~uVar6 & uVar9 ^ uVar27;
      uVar36 = ~uVar3 & uVar27 ^ uVar36;
      uVar25 = uVar25 ^ uVar29;
      uVar27 = uVar25 >> 0x24 | uVar25 << 0x1c;
      uVar26 = uVar26 ^ uVar32;
      uVar9 = uVar26 >> 0x2c | uVar26 << 0x14;
      uVar24 = uVar24 ^ uVar10;
      uVar24 = uVar24 >> 0x3d | uVar24 << 3;
      uVar17 = uVar17 ^ uVar19;
      uVar17 = uVar17 >> 0x13 | uVar17 << 0x2d;
      uVar5 = uVar5 ^ uVar14;
      uVar26 = uVar5 >> 3 | uVar5 << 0x3d;
      uVar40 = ~uVar26 & uVar27 ^ uVar17;
      uVar28 = ~uVar17 & uVar26 ^ uVar24;
      uVar25 = ~uVar9 & uVar24 ^ uVar27;
      uVar24 = ~uVar24 & uVar17 ^ uVar9;
      uVar26 = ~uVar27 & uVar9 ^ uVar26;
      uVar22 = uVar22 ^ uVar19;
      uVar17 = uVar22 >> 0x3f | uVar22 << 1;
      uVar12 = uVar12 ^ uVar14;
      uVar27 = uVar12 >> 0x3a | uVar12 << 6;
      uVar7 = uVar7 ^ uVar29;
      uVar22 = uVar7 >> 0x27 | uVar7 << 0x19;
      uVar23 = uVar23 ^ uVar32;
      uVar23 = uVar23 >> 0x38 | uVar23 << 8;
      uVar4 = uVar4 ^ uVar10;
      uVar5 = uVar4 >> 0x2e | uVar4 << 0x12;
      uVar4 = ~uVar5 & uVar17 ^ uVar23;
      uVar7 = ~uVar23 & uVar5 ^ uVar22;
      uVar3 = ~uVar27 & uVar22 ^ uVar17;
      uVar23 = ~uVar22 & uVar23 ^ uVar27;
      uVar5 = ~uVar17 & uVar27 ^ uVar5;
      uVar21 = uVar21 ^ uVar32;
      uVar22 = uVar21 >> 0x25 | uVar21 << 0x1b;
      uVar38 = uVar38 ^ uVar10;
      uVar12 = uVar38 >> 0x1c | uVar38 << 0x24;
      uVar18 = uVar18 ^ uVar19;
      uVar17 = uVar18 >> 0x36 | uVar18 << 10;
      uVar27 = ~uVar12 & uVar17 ^ uVar22;
      uVar1 = uVar1 ^ uVar14;
      uVar21 = uVar1 >> 0x31 | uVar1 << 0xf;
      uVar9 = ~uVar17 & uVar21 ^ uVar12;
      uVar2 = uVar2 ^ uVar29;
      uVar1 = uVar2 >> 8 | uVar2 << 0x38;
      uVar17 = ~uVar21 & uVar1 ^ uVar17;
      uVar21 = ~uVar1 & uVar22 ^ uVar21;
      uVar1 = ~uVar22 & uVar12 ^ uVar1;
      uVar14 = uVar14 ^ uVar31;
      uVar29 = uVar29 ^ uVar33;
      uVar32 = uVar32 ^ uVar13;
      uVar10 = uVar10 ^ uVar11;
      uVar19 = uVar19 ^ uVar30;
      uVar18 = uVar14 >> 2 | uVar14 << 0x3e;
      uVar11 = uVar29 >> 9 | uVar29 << 0x37;
      uVar2 = uVar32 >> 0x19 | uVar32 << 0x27;
      uVar22 = uVar10 >> 0x17 | uVar10 << 0x29;
      uVar13 = uVar19 >> 0x3e | uVar19 << 2;
      uVar12 = ~uVar13 & uVar18 ^ uVar22;
      uVar38 = ~uVar22 & uVar13 ^ uVar2;
      uVar31 = ~uVar11 & uVar2 ^ uVar18;
      uVar29 = ~uVar2 & uVar22 ^ uVar11;
      uVar13 = ~uVar18 & uVar11 ^ uVar13;
      uVar10 = uVar3 ^ uVar27 ^ uVar15 ^ uVar25 ^ uVar31;
      uVar2 = uVar23 ^ uVar9 ^ uVar6 ^ uVar24 ^ uVar29;
      uVar22 = uVar7 ^ uVar17 ^ uVar8 ^ uVar28 ^ uVar38;
      uVar33 = uVar4 ^ uVar21 ^ uVar39 ^ uVar40 ^ uVar12;
      uVar11 = uVar5 ^ uVar1 ^ uVar36 ^ uVar26 ^ uVar13;
      uVar30 = (uVar33 >> 0x3f | uVar33 << 1) ^ uVar2;
      uVar32 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar11;
      uVar37 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar22;
      uVar34 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar10;
      uVar33 = (uVar10 >> 0x3f | uVar10 << 1) ^ uVar33;
      uVar15 = uVar15 ^ uVar32;
      uVar24 = uVar24 ^ uVar34;
      uVar10 = uVar24 >> 0x14 | uVar24 << 0x2c;
      uVar7 = uVar7 ^ uVar30;
      uVar22 = uVar7 >> 0x15 | uVar7 << 0x2b;
      uVar14 = uVar15 ^ 0x8000808b ^ ~uVar10 & uVar22;
      uVar21 = uVar21 ^ uVar37;
      uVar11 = uVar21 >> 0x2b | uVar21 << 0x15;
      uVar13 = uVar13 ^ uVar33;
      uVar21 = uVar13 >> 0x32 | uVar13 << 0xe;
      uVar19 = ~uVar11 & uVar21 ^ uVar22;
      uVar2 = ~uVar21 & uVar15 ^ uVar11;
      uVar22 = ~uVar22 & uVar11 ^ uVar10;
      uVar21 = ~uVar15 & uVar10 ^ uVar21;
      uVar39 = uVar39 ^ uVar37;
      uVar11 = uVar39 >> 0x24 | uVar39 << 0x1c;
      uVar26 = uVar26 ^ uVar33;
      uVar13 = uVar26 >> 0x2c | uVar26 << 0x14;
      uVar3 = uVar3 ^ uVar32;
      uVar39 = uVar3 >> 0x3d | uVar3 << 3;
      uVar9 = uVar9 ^ uVar34;
      uVar9 = uVar9 >> 0x13 | uVar9 << 0x2d;
      uVar38 = uVar38 ^ uVar30;
      uVar26 = uVar38 >> 3 | uVar38 << 0x3d;
      uVar15 = ~uVar26 & uVar11 ^ uVar9;
      uVar38 = ~uVar9 & uVar26 ^ uVar39;
      uVar18 = ~uVar13 & uVar39 ^ uVar11;
      uVar10 = ~uVar39 & uVar9 ^ uVar13;
      uVar26 = ~uVar11 & uVar13 ^ uVar26;
      uVar6 = uVar6 ^ uVar34;
      uVar11 = uVar6 >> 0x3f | uVar6 << 1;
      uVar28 = uVar28 ^ uVar30;
      uVar39 = uVar28 >> 0x3a | uVar28 << 6;
      uVar4 = uVar4 ^ uVar37;
      uVar6 = uVar4 >> 0x27 | uVar4 << 0x19;
      uVar1 = uVar1 ^ uVar33;
      uVar9 = uVar1 >> 0x38 | uVar1 << 8;
      uVar31 = uVar31 ^ uVar32;
      uVar13 = uVar31 >> 0x2e | uVar31 << 0x12;
      uVar4 = ~uVar13 & uVar11 ^ uVar9;
      uVar31 = ~uVar9 & uVar13 ^ uVar6;
      uVar3 = ~uVar39 & uVar6 ^ uVar11;
      uVar24 = ~uVar6 & uVar9 ^ uVar39;
      uVar13 = ~uVar11 & uVar39 ^ uVar13;
      uVar36 = uVar36 ^ uVar33;
      uVar6 = uVar36 >> 0x25 | uVar36 << 0x1b;
      uVar25 = uVar25 ^ uVar32;
      uVar39 = uVar25 >> 0x1c | uVar25 << 0x24;
      uVar23 = uVar23 ^ uVar34;
      uVar28 = uVar23 >> 0x36 | uVar23 << 10;
      uVar11 = ~uVar39 & uVar28 ^ uVar6;
      uVar17 = uVar17 ^ uVar30;
      uVar17 = uVar17 >> 0x31 | uVar17 << 0xf;
      uVar9 = ~uVar28 & uVar17 ^ uVar39;
      uVar12 = uVar12 ^ uVar37;
      uVar1 = uVar12 >> 8 | uVar12 << 0x38;
      uVar28 = ~uVar17 & uVar1 ^ uVar28;
      uVar17 = ~uVar1 & uVar6 ^ uVar17;
      uVar1 = ~uVar6 & uVar39 ^ uVar1;
      uVar30 = uVar30 ^ uVar8;
      uVar37 = uVar37 ^ uVar40;
      uVar33 = uVar33 ^ uVar5;
      uVar32 = uVar32 ^ uVar27;
      uVar34 = uVar34 ^ uVar29;
      uVar23 = uVar30 >> 2 | uVar30 << 0x3e;
      uVar36 = uVar37 >> 9 | uVar37 << 0x37;
      uVar6 = uVar33 >> 0x19 | uVar33 << 0x27;
      uVar25 = uVar32 >> 0x17 | uVar32 << 0x29;
      uVar27 = uVar34 >> 0x3e | uVar34 << 2;
      uVar39 = ~uVar27 & uVar23 ^ uVar25;
      uVar32 = ~uVar25 & uVar27 ^ uVar6;
      uVar30 = ~uVar36 & uVar6 ^ uVar23;
      uVar29 = ~uVar6 & uVar25 ^ uVar36;
      uVar27 = ~uVar23 & uVar36 ^ uVar27;
      uVar25 = uVar3 ^ uVar11 ^ uVar14 ^ uVar18 ^ uVar30;
      uVar36 = uVar24 ^ uVar9 ^ uVar22 ^ uVar10 ^ uVar29;
      uVar6 = uVar31 ^ uVar28 ^ uVar19 ^ uVar38 ^ uVar32;
      uVar7 = uVar4 ^ uVar17 ^ uVar2 ^ uVar15 ^ uVar39;
      uVar23 = uVar13 ^ uVar1 ^ uVar21 ^ uVar26 ^ uVar27;
      uVar40 = (uVar7 >> 0x3f | uVar7 << 1) ^ uVar36;
      uVar8 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar23;
      uVar5 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar6;
      uVar34 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar25;
      uVar7 = (uVar25 >> 0x3f | uVar25 << 1) ^ uVar7;
      uVar14 = uVar14 ^ uVar8;
      uVar10 = uVar10 ^ uVar34;
      uVar23 = uVar10 >> 0x14 | uVar10 << 0x2c;
      uVar31 = uVar31 ^ uVar40;
      uVar6 = uVar31 >> 0x15 | uVar31 << 0x2b;
      uVar31 = uVar14 ^ 0x800000000000008b ^ ~uVar23 & uVar6;
      uVar17 = uVar17 ^ uVar5;
      uVar17 = uVar17 >> 0x2b | uVar17 << 0x15;
      uVar27 = uVar27 ^ uVar7;
      uVar36 = uVar27 >> 0x32 | uVar27 << 0xe;
      uVar33 = ~uVar17 & uVar36 ^ uVar6;
      uVar25 = ~uVar36 & uVar14 ^ uVar17;
      uVar6 = ~uVar6 & uVar17 ^ uVar23;
      uVar36 = ~uVar14 & uVar23 ^ uVar36;
      uVar2 = uVar2 ^ uVar5;
      uVar17 = uVar2 >> 0x24 | uVar2 << 0x1c;
      uVar26 = uVar26 ^ uVar7;
      uVar23 = uVar26 >> 0x2c | uVar26 << 0x14;
      uVar3 = uVar3 ^ uVar8;
      uVar27 = uVar3 >> 0x3d | uVar3 << 3;
      uVar9 = uVar9 ^ uVar34;
      uVar9 = uVar9 >> 0x13 | uVar9 << 0x2d;
      uVar32 = uVar32 ^ uVar40;
      uVar26 = uVar32 >> 3 | uVar32 << 0x3d;
      uVar14 = ~uVar26 & uVar17 ^ uVar9;
      uVar12 = ~uVar9 & uVar26 ^ uVar27;
      uVar2 = ~uVar23 & uVar27 ^ uVar17;
      uVar27 = ~uVar27 & uVar9 ^ uVar23;
      uVar26 = ~uVar17 & uVar23 ^ uVar26;
      uVar22 = uVar22 ^ uVar34;
      uVar17 = uVar22 >> 0x3f | uVar22 << 1;
      uVar38 = uVar38 ^ uVar40;
      uVar32 = uVar38 >> 0x3a | uVar38 << 6;
      uVar4 = uVar4 ^ uVar5;
      uVar22 = uVar4 >> 0x27 | uVar4 << 0x19;
      uVar1 = uVar1 ^ uVar7;
      uVar1 = uVar1 >> 0x38 | uVar1 << 8;
      uVar30 = uVar30 ^ uVar8;
      uVar23 = uVar30 >> 0x2e | uVar30 << 0x12;
      uVar3 = ~uVar23 & uVar17 ^ uVar1;
      uVar9 = ~uVar1 & uVar23 ^ uVar22;
      uVar38 = ~uVar32 & uVar22 ^ uVar17;
      uVar22 = ~uVar22 & uVar1 ^ uVar32;
      uVar23 = ~uVar17 & uVar32 ^ uVar23;
      uVar21 = uVar21 ^ uVar7;
      uVar21 = uVar21 >> 0x25 | uVar21 << 0x1b;
      uVar18 = uVar18 ^ uVar8;
      uVar1 = uVar18 >> 0x1c | uVar18 << 0x24;
      uVar24 = uVar24 ^ uVar34;
      uVar32 = uVar24 >> 0x36 | uVar24 << 10;
      uVar10 = ~uVar1 & uVar32 ^ uVar21;
      uVar28 = uVar28 ^ uVar40;
      uVar17 = uVar28 >> 0x31 | uVar28 << 0xf;
      uVar18 = ~uVar32 & uVar17 ^ uVar1;
      uVar39 = uVar39 ^ uVar5;
      uVar24 = uVar39 >> 8 | uVar39 << 0x38;
      uVar32 = ~uVar17 & uVar24 ^ uVar32;
      uVar17 = ~uVar24 & uVar21 ^ uVar17;
      uVar24 = ~uVar21 & uVar1 ^ uVar24;
      uVar40 = uVar40 ^ uVar19;
      uVar5 = uVar5 ^ uVar15;
      uVar7 = uVar7 ^ uVar13;
      uVar8 = uVar8 ^ uVar11;
      uVar34 = uVar34 ^ uVar29;
      uVar21 = uVar40 >> 2 | uVar40 << 0x3e;
      uVar11 = uVar5 >> 9 | uVar5 << 0x37;
      uVar1 = uVar7 >> 0x19 | uVar7 << 0x27;
      uVar13 = uVar8 >> 0x17 | uVar8 << 0x29;
      uVar5 = uVar34 >> 0x3e | uVar34 << 2;
      uVar39 = ~uVar5 & uVar21 ^ uVar13;
      uVar7 = ~uVar13 & uVar5 ^ uVar1;
      uVar4 = ~uVar11 & uVar1 ^ uVar21;
      uVar15 = ~uVar1 & uVar13 ^ uVar11;
      uVar5 = ~uVar21 & uVar11 ^ uVar5;
      uVar1 = uVar38 ^ uVar10 ^ uVar31 ^ uVar2 ^ uVar4;
      uVar21 = uVar22 ^ uVar18 ^ uVar6 ^ uVar27 ^ uVar15;
      uVar13 = uVar9 ^ uVar32 ^ uVar33 ^ uVar12 ^ uVar7;
      uVar11 = uVar3 ^ uVar17 ^ uVar25 ^ uVar14 ^ uVar39;
      uVar28 = uVar23 ^ uVar24 ^ uVar36 ^ uVar26 ^ uVar5;
      uVar19 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar21;
      uVar40 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar28;
      uVar8 = (uVar28 >> 0x3f | uVar28 << 1) ^ uVar13;
      uVar28 = (uVar13 >> 0x3f | uVar13 << 1) ^ uVar1;
      uVar11 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar11;
      uVar31 = uVar31 ^ uVar40;
      uVar27 = uVar27 ^ uVar28;
      uVar21 = uVar27 >> 0x14 | uVar27 << 0x2c;
      uVar9 = uVar9 ^ uVar19;
      uVar27 = uVar9 >> 0x15 | uVar9 << 0x2b;
      uVar30 = uVar31 ^ 0x8000000000008089 ^ ~uVar21 & uVar27;
      uVar17 = uVar17 ^ uVar8;
      uVar17 = uVar17 >> 0x2b | uVar17 << 0x15;
      uVar5 = uVar5 ^ uVar11;
      uVar13 = uVar5 >> 0x32 | uVar5 << 0xe;
      uVar5 = ~uVar17 & uVar13 ^ uVar27;
      uVar9 = ~uVar13 & uVar31 ^ uVar17;
      uVar1 = ~uVar27 & uVar17 ^ uVar21;
      uVar13 = ~uVar31 & uVar21 ^ uVar13;
      uVar25 = uVar25 ^ uVar8;
      uVar21 = uVar25 >> 0x24 | uVar25 << 0x1c;
      uVar26 = uVar26 ^ uVar11;
      uVar17 = uVar26 >> 0x2c | uVar26 << 0x14;
      uVar38 = uVar38 ^ uVar40;
      uVar27 = uVar38 >> 0x3d | uVar38 << 3;
      uVar18 = uVar18 ^ uVar28;
      uVar25 = uVar18 >> 0x13 | uVar18 << 0x2d;
      uVar7 = uVar7 ^ uVar19;
      uVar26 = uVar7 >> 3 | uVar7 << 0x3d;
      uVar31 = ~uVar26 & uVar21 ^ uVar25;
      uVar38 = ~uVar25 & uVar26 ^ uVar27;
      uVar18 = ~uVar17 & uVar27 ^ uVar21;
      uVar25 = ~uVar27 & uVar25 ^ uVar17;
      uVar26 = ~uVar21 & uVar17 ^ uVar26;
      uVar6 = uVar6 ^ uVar28;
      uVar21 = uVar6 >> 0x3f | uVar6 << 1;
      uVar12 = uVar12 ^ uVar19;
      uVar27 = uVar12 >> 0x3a | uVar12 << 6;
      uVar3 = uVar3 ^ uVar8;
      uVar6 = uVar3 >> 0x27 | uVar3 << 0x19;
      uVar24 = uVar24 ^ uVar11;
      uVar12 = uVar24 >> 0x38 | uVar24 << 8;
      uVar4 = uVar4 ^ uVar40;
      uVar17 = uVar4 >> 0x2e | uVar4 << 0x12;
      uVar3 = ~uVar17 & uVar21 ^ uVar12;
      uVar29 = ~uVar12 & uVar17 ^ uVar6;
      uVar7 = ~uVar27 & uVar6 ^ uVar21;
      uVar12 = ~uVar6 & uVar12 ^ uVar27;
      uVar17 = ~uVar21 & uVar27 ^ uVar17;
      uVar36 = uVar36 ^ uVar11;
      uVar6 = uVar36 >> 0x25 | uVar36 << 0x1b;
      uVar2 = uVar2 ^ uVar40;
      uVar36 = uVar2 >> 0x1c | uVar2 << 0x24;
      uVar22 = uVar22 ^ uVar28;
      uVar24 = uVar22 >> 0x36 | uVar22 << 10;
      uVar21 = ~uVar36 & uVar24 ^ uVar6;
      uVar32 = uVar32 ^ uVar19;
      uVar22 = uVar32 >> 0x31 | uVar32 << 0xf;
      uVar27 = ~uVar24 & uVar22 ^ uVar36;
      uVar39 = uVar39 ^ uVar8;
      uVar2 = uVar39 >> 8 | uVar39 << 0x38;
      uVar24 = ~uVar22 & uVar2 ^ uVar24;
      uVar22 = ~uVar2 & uVar6 ^ uVar22;
      uVar2 = ~uVar6 & uVar36 ^ uVar2;
      uVar19 = uVar19 ^ uVar33;
      uVar8 = uVar8 ^ uVar14;
      uVar11 = uVar11 ^ uVar23;
      uVar40 = uVar40 ^ uVar10;
      uVar28 = uVar28 ^ uVar15;
      uVar32 = uVar19 >> 2 | uVar19 << 0x3e;
      uVar23 = uVar8 >> 9 | uVar8 << 0x37;
      uVar10 = uVar11 >> 0x19 | uVar11 << 0x27;
      uVar11 = uVar40 >> 0x17 | uVar40 << 0x29;
      uVar6 = uVar28 >> 0x3e | uVar28 << 2;
      uVar39 = ~uVar6 & uVar32 ^ uVar11;
      uVar36 = ~uVar11 & uVar6 ^ uVar10;
      uVar8 = ~uVar23 & uVar10 ^ uVar32;
      uVar19 = ~uVar10 & uVar11 ^ uVar23;
      uVar6 = ~uVar32 & uVar23 ^ uVar6;
      uVar23 = uVar7 ^ uVar21 ^ uVar30 ^ uVar18 ^ uVar8;
      uVar28 = uVar12 ^ uVar27 ^ uVar1 ^ uVar25 ^ uVar19;
      uVar32 = uVar29 ^ uVar24 ^ uVar5 ^ uVar38 ^ uVar36;
      uVar10 = uVar3 ^ uVar22 ^ uVar9 ^ uVar31 ^ uVar39;
      uVar11 = uVar17 ^ uVar2 ^ uVar13 ^ uVar26 ^ uVar6;
      uVar4 = (uVar10 >> 0x3f | uVar10 << 1) ^ uVar28;
      uVar28 = (uVar28 >> 0x3f | uVar28 << 1) ^ uVar11;
      uVar33 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar32;
      uVar34 = (uVar32 >> 0x3f | uVar32 << 1) ^ uVar23;
      uVar10 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar10;
      uVar30 = uVar30 ^ uVar28;
      uVar25 = uVar25 ^ uVar34;
      uVar11 = uVar25 >> 0x14 | uVar25 << 0x2c;
      uVar29 = uVar29 ^ uVar4;
      uVar23 = uVar29 >> 0x15 | uVar29 << 0x2b;
      uVar14 = uVar30 ^ 0x8000000000008003 ^ ~uVar11 & uVar23;
      uVar22 = uVar22 ^ uVar33;
      uVar22 = uVar22 >> 0x2b | uVar22 << 0x15;
      uVar6 = uVar6 ^ uVar10;
      uVar6 = uVar6 >> 0x32 | uVar6 << 0xe;
      uVar40 = ~uVar22 & uVar6 ^ uVar23;
      uVar25 = ~uVar6 & uVar30 ^ uVar22;
      uVar22 = ~uVar23 & uVar22 ^ uVar11;
      uVar6 = ~uVar30 & uVar11 ^ uVar6;
      uVar9 = uVar9 ^ uVar33;
      uVar11 = uVar9 >> 0x24 | uVar9 << 0x1c;
      uVar26 = uVar26 ^ uVar10;
      uVar23 = uVar26 >> 0x2c | uVar26 << 0x14;
      uVar7 = uVar7 ^ uVar28;
      uVar32 = uVar7 >> 0x3d | uVar7 << 3;
      uVar27 = uVar27 ^ uVar34;
      uVar27 = uVar27 >> 0x13 | uVar27 << 0x2d;
      uVar36 = uVar36 ^ uVar4;
      uVar26 = uVar36 >> 3 | uVar36 << 0x3d;
      uVar29 = ~uVar26 & uVar11 ^ uVar27;
      uVar7 = ~uVar27 & uVar26 ^ uVar32;
      uVar36 = ~uVar23 & uVar32 ^ uVar11;
      uVar27 = ~uVar32 & uVar27 ^ uVar23;
      uVar26 = ~uVar11 & uVar23 ^ uVar26;
      uVar1 = uVar1 ^ uVar34;
      uVar11 = uVar1 >> 0x3f | uVar1 << 1;
      uVar38 = uVar38 ^ uVar4;
      uVar32 = uVar38 >> 0x3a | uVar38 << 6;
      uVar3 = uVar3 ^ uVar33;
      uVar1 = uVar3 >> 0x27 | uVar3 << 0x19;
      uVar2 = uVar2 ^ uVar10;
      uVar2 = uVar2 >> 0x38 | uVar2 << 8;
      uVar8 = uVar8 ^ uVar28;
      uVar23 = uVar8 >> 0x2e | uVar8 << 0x12;
      uVar15 = ~uVar23 & uVar11 ^ uVar2;
      uVar9 = ~uVar2 & uVar23 ^ uVar1;
      uVar3 = ~uVar32 & uVar1 ^ uVar11;
      uVar2 = ~uVar1 & uVar2 ^ uVar32;
      uVar23 = ~uVar11 & uVar32 ^ uVar23;
      uVar13 = uVar13 ^ uVar10;
      uVar8 = uVar13 >> 0x25 | uVar13 << 0x1b;
      uVar18 = uVar18 ^ uVar28;
      uVar11 = uVar18 >> 0x1c | uVar18 << 0x24;
      uVar12 = uVar12 ^ uVar34;
      uVar32 = uVar12 >> 0x36 | uVar12 << 10;
      uVar1 = ~uVar11 & uVar32 ^ uVar8;
      uVar24 = uVar24 ^ uVar4;
      uVar13 = uVar24 >> 0x31 | uVar24 << 0xf;
      uVar12 = ~uVar32 & uVar13 ^ uVar11;
      uVar39 = uVar39 ^ uVar33;
      uVar38 = uVar39 >> 8 | uVar39 << 0x38;
      uVar32 = ~uVar13 & uVar38 ^ uVar32;
      uVar13 = ~uVar38 & uVar8 ^ uVar13;
      uVar38 = ~uVar8 & uVar11 ^ uVar38;
      uVar4 = uVar4 ^ uVar5;
      uVar33 = uVar33 ^ uVar31;
      uVar10 = uVar10 ^ uVar17;
      uVar28 = uVar28 ^ uVar21;
      uVar34 = uVar34 ^ uVar19;
      uVar11 = uVar4 >> 2 | uVar4 << 0x3e;
      uVar21 = uVar33 >> 9 | uVar33 << 0x37;
      uVar17 = uVar10 >> 0x19 | uVar10 << 0x27;
      uVar18 = uVar28 >> 0x17 | uVar28 << 0x29;
      uVar39 = uVar34 >> 0x3e | uVar34 << 2;
      uVar10 = ~uVar39 & uVar11 ^ uVar18;
      uVar24 = ~uVar18 & uVar39 ^ uVar17;
      uVar19 = ~uVar21 & uVar17 ^ uVar11;
      uVar37 = ~uVar17 & uVar18 ^ uVar21;
      uVar39 = ~uVar11 & uVar21 ^ uVar39;
      uVar17 = uVar3 ^ uVar1 ^ uVar14 ^ uVar36 ^ uVar19;
      uVar21 = uVar2 ^ uVar12 ^ uVar22 ^ uVar27 ^ uVar37;
      uVar28 = uVar9 ^ uVar32 ^ uVar40 ^ uVar7 ^ uVar24;
      uVar11 = uVar15 ^ uVar13 ^ uVar25 ^ uVar29 ^ uVar10;
      uVar18 = uVar23 ^ uVar38 ^ uVar6 ^ uVar26 ^ uVar39;
      uVar5 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar21;
      uVar31 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar18;
      uVar30 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar28;
      uVar34 = (uVar28 >> 0x3f | uVar28 << 1) ^ uVar17;
      uVar11 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar11;
      uVar14 = uVar14 ^ uVar31;
      uVar27 = uVar27 ^ uVar34;
      uVar21 = uVar27 >> 0x14 | uVar27 << 0x2c;
      uVar9 = uVar9 ^ uVar5;
      uVar17 = uVar9 >> 0x15 | uVar9 << 0x2b;
      uVar18 = uVar14 ^ 0x8000000000008002 ^ ~uVar21 & uVar17;
      uVar13 = uVar13 ^ uVar30;
      uVar27 = uVar13 >> 0x2b | uVar13 << 0x15;
      uVar39 = uVar39 ^ uVar11;
      uVar13 = uVar39 >> 0x32 | uVar39 << 0xe;
      uVar33 = ~uVar27 & uVar13 ^ uVar17;
      uVar39 = ~uVar13 & uVar14 ^ uVar27;
      uVar9 = ~uVar17 & uVar27 ^ uVar21;
      uVar13 = ~uVar14 & uVar21 ^ uVar13;
      uVar25 = uVar25 ^ uVar30;
      uVar21 = uVar25 >> 0x24 | uVar25 << 0x1c;
      uVar26 = uVar26 ^ uVar11;
      uVar17 = uVar26 >> 0x2c | uVar26 << 0x14;
      uVar3 = uVar3 ^ uVar31;
      uVar27 = uVar3 >> 0x3d | uVar3 << 3;
      uVar12 = uVar12 ^ uVar34;
      uVar25 = uVar12 >> 0x13 | uVar12 << 0x2d;
      uVar24 = uVar24 ^ uVar5;
      uVar26 = uVar24 >> 3 | uVar24 << 0x3d;
      uVar14 = ~uVar26 & uVar21 ^ uVar25;
      uVar8 = ~uVar25 & uVar26 ^ uVar27;
      uVar24 = ~uVar17 & uVar27 ^ uVar21;
      uVar4 = ~uVar27 & uVar25 ^ uVar17;
      uVar26 = ~uVar21 & uVar17 ^ uVar26;
      uVar22 = uVar22 ^ uVar34;
      uVar21 = uVar22 >> 0x3f | uVar22 << 1;
      uVar7 = uVar7 ^ uVar5;
      uVar27 = uVar7 >> 0x3a | uVar7 << 6;
      uVar15 = uVar15 ^ uVar30;
      uVar28 = uVar15 >> 0x27 | uVar15 << 0x19;
      uVar38 = uVar38 ^ uVar11;
      uVar25 = uVar38 >> 0x38 | uVar38 << 8;
      uVar19 = uVar19 ^ uVar31;
      uVar17 = uVar19 >> 0x2e | uVar19 << 0x12;
      uVar19 = ~uVar17 & uVar21 ^ uVar25;
      uVar22 = ~uVar25 & uVar17 ^ uVar28;
      uVar12 = ~uVar27 & uVar28 ^ uVar21;
      uVar28 = ~uVar28 & uVar25 ^ uVar27;
      uVar17 = ~uVar21 & uVar27 ^ uVar17;
      uVar6 = uVar6 ^ uVar11;
      uVar25 = uVar6 >> 0x25 | uVar6 << 0x1b;
      uVar36 = uVar36 ^ uVar31;
      uVar36 = uVar36 >> 0x1c | uVar36 << 0x24;
      uVar2 = uVar2 ^ uVar34;
      uVar7 = uVar2 >> 0x36 | uVar2 << 10;
      uVar21 = ~uVar36 & uVar7 ^ uVar25;
      uVar32 = uVar32 ^ uVar5;
      uVar27 = uVar32 >> 0x31 | uVar32 << 0xf;
      uVar38 = ~uVar7 & uVar27 ^ uVar36;
      uVar10 = uVar10 ^ uVar30;
      uVar6 = uVar10 >> 8 | uVar10 << 0x38;
      uVar7 = ~uVar27 & uVar6 ^ uVar7;
      uVar27 = ~uVar6 & uVar25 ^ uVar27;
      uVar6 = ~uVar25 & uVar36 ^ uVar6;
      uVar5 = uVar5 ^ uVar40;
      uVar30 = uVar30 ^ uVar29;
      uVar11 = uVar11 ^ uVar23;
      uVar31 = uVar31 ^ uVar1;
      uVar34 = uVar34 ^ uVar37;
      uVar23 = uVar5 >> 2 | uVar5 << 0x3e;
      uVar32 = uVar30 >> 9 | uVar30 << 0x37;
      uVar25 = uVar11 >> 0x19 | uVar11 << 0x27;
      uVar36 = uVar31 >> 0x17 | uVar31 << 0x29;
      uVar11 = uVar34 >> 0x3e | uVar34 << 2;
      uVar2 = ~uVar11 & uVar23 ^ uVar36;
      uVar1 = ~uVar36 & uVar11 ^ uVar25;
      uVar5 = ~uVar32 & uVar25 ^ uVar23;
      uVar29 = ~uVar25 & uVar36 ^ uVar32;
      uVar11 = ~uVar23 & uVar32 ^ uVar11;
      uVar32 = uVar12 ^ uVar21 ^ uVar18 ^ uVar24 ^ uVar5;
      uVar36 = uVar28 ^ uVar38 ^ uVar9 ^ uVar4 ^ uVar29;
      uVar25 = uVar22 ^ uVar7 ^ uVar33 ^ uVar8 ^ uVar1;
      uVar30 = uVar19 ^ uVar27 ^ uVar39 ^ uVar14 ^ uVar2;
      uVar23 = uVar17 ^ uVar6 ^ uVar13 ^ uVar26 ^ uVar11;
      uVar3 = (uVar30 >> 0x3f | uVar30 << 1) ^ uVar36;
      uVar15 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar23;
      uVar36 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar25;
      uVar40 = (uVar25 >> 0x3f | uVar25 << 1) ^ uVar32;
      uVar30 = (uVar32 >> 0x3f | uVar32 << 1) ^ uVar30;
      uVar18 = uVar18 ^ uVar15;
      uVar4 = uVar4 ^ uVar40;
      uVar23 = uVar4 >> 0x14 | uVar4 << 0x2c;
      uVar22 = uVar22 ^ uVar3;
      uVar25 = uVar22 >> 0x15 | uVar22 << 0x2b;
      uVar4 = uVar18 ^ 0x8000000000000080 ^ ~uVar23 & uVar25;
      uVar27 = uVar27 ^ uVar36;
      uVar27 = uVar27 >> 0x2b | uVar27 << 0x15;
      uVar11 = uVar11 ^ uVar30;
      uVar22 = uVar11 >> 0x32 | uVar11 << 0xe;
      uVar32 = ~uVar27 & uVar22 ^ uVar25;
      uVar25 = ~uVar25 & uVar27 ^ uVar23;
      uVar27 = ~uVar22 & uVar18 ^ uVar27;
      uVar22 = ~uVar18 & uVar23 ^ uVar22;
      uVar39 = uVar39 ^ uVar36;
      uVar11 = uVar39 >> 0x24 | uVar39 << 0x1c;
      uVar26 = uVar26 ^ uVar30;
      uVar23 = uVar26 >> 0x2c | uVar26 << 0x14;
      uVar12 = uVar12 ^ uVar15;
      uVar12 = uVar12 >> 0x3d | uVar12 << 3;
      uVar38 = uVar38 ^ uVar40;
      uVar38 = uVar38 >> 0x13 | uVar38 << 0x2d;
      uVar1 = uVar1 ^ uVar3;
      uVar26 = uVar1 >> 3 | uVar1 << 0x3d;
      uVar1 = ~uVar26 & uVar11 ^ uVar38;
      uVar10 = ~uVar38 & uVar26 ^ uVar12;
      uVar39 = ~uVar23 & uVar12 ^ uVar11;
      uVar18 = ~uVar12 & uVar38 ^ uVar23;
      uVar26 = ~uVar11 & uVar23 ^ uVar26;
      uVar9 = uVar9 ^ uVar40;
      uVar11 = uVar9 >> 0x3f | uVar9 << 1;
      uVar8 = uVar8 ^ uVar3;
      uVar9 = uVar8 >> 0x3a | uVar8 << 6;
      uVar19 = uVar19 ^ uVar36;
      uVar12 = uVar19 >> 0x27 | uVar19 << 0x19;
      uVar6 = uVar6 ^ uVar30;
      uVar6 = uVar6 >> 0x38 | uVar6 << 8;
      uVar5 = uVar5 ^ uVar15;
      uVar23 = uVar5 >> 0x2e | uVar5 << 0x12;
      uVar5 = ~uVar23 & uVar11 ^ uVar6;
      uVar19 = ~uVar6 & uVar23 ^ uVar12;
      uVar8 = ~uVar9 & uVar12 ^ uVar11;
      uVar6 = ~uVar12 & uVar6 ^ uVar9;
      uVar23 = ~uVar11 & uVar9 ^ uVar23;
      uVar13 = uVar13 ^ uVar30;
      uVar12 = uVar13 >> 0x25 | uVar13 << 0x1b;
      uVar24 = uVar24 ^ uVar15;
      uVar38 = uVar24 >> 0x1c | uVar24 << 0x24;
      uVar28 = uVar28 ^ uVar40;
      uVar13 = uVar28 >> 0x36 | uVar28 << 10;
      uVar9 = ~uVar38 & uVar13 ^ uVar12;
      uVar7 = uVar7 ^ uVar3;
      uVar11 = uVar7 >> 0x31 | uVar7 << 0xf;
      uVar24 = ~uVar13 & uVar11 ^ uVar38;
      uVar2 = uVar2 ^ uVar36;
      uVar31 = uVar2 >> 8 | uVar2 << 0x38;
      uVar13 = ~uVar11 & uVar31 ^ uVar13;
      uVar11 = ~uVar31 & uVar12 ^ uVar11;
      uVar31 = ~uVar12 & uVar38 ^ uVar31;
      uVar3 = uVar3 ^ uVar33;
      uVar36 = uVar36 ^ uVar14;
      uVar30 = uVar30 ^ uVar17;
      uVar15 = uVar15 ^ uVar21;
      uVar40 = uVar40 ^ uVar29;
      uVar2 = uVar3 >> 2 | uVar3 << 0x3e;
      uVar21 = uVar36 >> 9 | uVar36 << 0x37;
      uVar36 = uVar30 >> 0x19 | uVar30 << 0x27;
      uVar12 = uVar15 >> 0x17 | uVar15 << 0x29;
      uVar28 = uVar40 >> 0x3e | uVar40 << 2;
      uVar17 = ~uVar28 & uVar2 ^ uVar12;
      uVar3 = ~uVar12 & uVar28 ^ uVar36;
      uVar40 = ~uVar21 & uVar36 ^ uVar2;
      uVar29 = ~uVar36 & uVar12 ^ uVar21;
      uVar28 = ~uVar2 & uVar21 ^ uVar28;
      uVar21 = uVar8 ^ uVar9 ^ uVar4 ^ uVar39 ^ uVar40;
      uVar36 = uVar6 ^ uVar24 ^ uVar25 ^ uVar18 ^ uVar29;
      uVar7 = uVar19 ^ uVar13 ^ uVar32 ^ uVar10 ^ uVar3;
      uVar14 = uVar5 ^ uVar11 ^ uVar27 ^ uVar1 ^ uVar17;
      uVar2 = uVar23 ^ uVar31 ^ uVar22 ^ uVar26 ^ uVar28;
      uVar12 = (uVar14 >> 0x3f | uVar14 << 1) ^ uVar36;
      uVar38 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar2;
      uVar15 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar7;
      uVar33 = (uVar7 >> 0x3f | uVar7 << 1) ^ uVar21;
      uVar14 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar14;
      uVar4 = uVar4 ^ uVar38;
      uVar18 = uVar18 ^ uVar33;
      uVar21 = uVar18 >> 0x14 | uVar18 << 0x2c;
      uVar19 = uVar19 ^ uVar12;
      uVar36 = uVar19 >> 0x15 | uVar19 << 0x2b;
      uVar30 = uVar4 ^ 0x800a ^ ~uVar21 & uVar36;
      uVar11 = uVar11 ^ uVar15;
      uVar2 = uVar11 >> 0x2b | uVar11 << 0x15;
      uVar28 = uVar28 ^ uVar14;
      uVar7 = uVar28 >> 0x32 | uVar28 << 0xe;
      uVar18 = ~uVar2 & uVar7 ^ uVar36;
      uVar36 = ~uVar36 & uVar2 ^ uVar21;
      uVar2 = ~uVar7 & uVar4 ^ uVar2;
      uVar7 = ~uVar4 & uVar21 ^ uVar7;
      uVar27 = uVar27 ^ uVar15;
      uVar11 = uVar27 >> 0x24 | uVar27 << 0x1c;
      uVar26 = uVar26 ^ uVar14;
      uVar26 = uVar26 >> 0x2c | uVar26 << 0x14;
      uVar8 = uVar8 ^ uVar38;
      uVar27 = uVar8 >> 0x3d | uVar8 << 3;
      uVar24 = uVar24 ^ uVar33;
      uVar4 = uVar24 >> 0x13 | uVar24 << 0x2d;
      uVar3 = uVar3 ^ uVar12;
      uVar21 = uVar3 >> 3 | uVar3 << 0x3d;
      uVar24 = ~uVar21 & uVar11 ^ uVar4;
      uVar28 = ~uVar4 & uVar21 ^ uVar27;
      uVar3 = ~uVar26 & uVar27 ^ uVar11;
      uVar27 = ~uVar27 & uVar4 ^ uVar26;
      uVar21 = ~uVar11 & uVar26 ^ uVar21;
      uVar25 = uVar25 ^ uVar33;
      uVar11 = uVar25 >> 0x3f | uVar25 << 1;
      uVar10 = uVar10 ^ uVar12;
      uVar25 = uVar10 >> 0x3a | uVar10 << 6;
      uVar5 = uVar5 ^ uVar15;
      uVar10 = uVar5 >> 0x27 | uVar5 << 0x19;
      uVar31 = uVar31 ^ uVar14;
      uVar31 = uVar31 >> 0x38 | uVar31 << 8;
      uVar40 = uVar40 ^ uVar38;
      uVar26 = uVar40 >> 0x2e | uVar40 << 0x12;
      uVar8 = ~uVar26 & uVar11 ^ uVar31;
      uVar5 = ~uVar31 & uVar26 ^ uVar10;
      uVar4 = ~uVar25 & uVar10 ^ uVar11;
      uVar10 = ~uVar10 & uVar31 ^ uVar25;
      uVar26 = ~uVar11 & uVar25 ^ uVar26;
      uVar22 = uVar22 ^ uVar14;
      uVar25 = uVar22 >> 0x25 | uVar22 << 0x1b;
      uVar39 = uVar39 ^ uVar38;
      uVar39 = uVar39 >> 0x1c | uVar39 << 0x24;
      uVar6 = uVar6 ^ uVar33;
      uVar6 = uVar6 >> 0x36 | uVar6 << 10;
      uVar11 = ~uVar39 & uVar6 ^ uVar25;
      uVar13 = uVar13 ^ uVar12;
      uVar31 = uVar13 >> 0x31 | uVar13 << 0xf;
      uVar40 = ~uVar6 & uVar31 ^ uVar39;
      uVar17 = uVar17 ^ uVar15;
      uVar13 = uVar17 >> 8 | uVar17 << 0x38;
      uVar6 = ~uVar31 & uVar13 ^ uVar6;
      uVar31 = ~uVar13 & uVar25 ^ uVar31;
      uVar13 = ~uVar25 & uVar39 ^ uVar13;
      uVar12 = uVar12 ^ uVar32;
      uVar15 = uVar15 ^ uVar1;
      uVar14 = uVar14 ^ uVar23;
      uVar38 = uVar38 ^ uVar9;
      uVar33 = uVar33 ^ uVar29;
      uVar9 = uVar12 >> 2 | uVar12 << 0x3e;
      uVar17 = uVar15 >> 9 | uVar15 << 0x37;
      uVar22 = uVar14 >> 0x19 | uVar14 << 0x27;
      uVar25 = uVar38 >> 0x17 | uVar38 << 0x29;
      uVar23 = uVar33 >> 0x3e | uVar33 << 2;
      uVar39 = ~uVar23 & uVar9 ^ uVar25;
      uVar32 = ~uVar25 & uVar23 ^ uVar22;
      uVar12 = ~uVar17 & uVar22 ^ uVar9;
      uVar29 = ~uVar22 & uVar25 ^ uVar17;
      uVar23 = ~uVar9 & uVar17 ^ uVar23;
      uVar25 = uVar4 ^ uVar11 ^ uVar30 ^ uVar3 ^ uVar12;
      uVar22 = uVar10 ^ uVar40 ^ uVar36 ^ uVar27 ^ uVar29;
      uVar9 = uVar5 ^ uVar6 ^ uVar18 ^ uVar28 ^ uVar32;
      uVar19 = uVar8 ^ uVar31 ^ uVar2 ^ uVar24 ^ uVar39;
      uVar17 = uVar26 ^ uVar13 ^ uVar7 ^ uVar21 ^ uVar23;
      uVar1 = (uVar19 >> 0x3f | uVar19 << 1) ^ uVar22;
      uVar35 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar17;
      uVar34 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar9;
      uVar37 = (uVar9 >> 0x3f | uVar9 << 1) ^ uVar25;
      uVar19 = (uVar25 >> 0x3f | uVar25 << 1) ^ uVar19;
      uVar30 = uVar30 ^ uVar35;
      uVar27 = uVar27 ^ uVar37;
      uVar17 = uVar27 >> 0x14 | uVar27 << 0x2c;
      uVar5 = uVar5 ^ uVar1;
      uVar22 = uVar5 >> 0x15 | uVar5 << 0x2b;
      uVar33 = uVar30 ^ 0x800000008000000a ^ ~uVar17 & uVar22;
      uVar31 = uVar31 ^ uVar34;
      uVar27 = uVar31 >> 0x2b | uVar31 << 0x15;
      uVar23 = uVar23 ^ uVar19;
      uVar23 = uVar23 >> 0x32 | uVar23 << 0xe;
      uVar14 = ~uVar27 & uVar23 ^ uVar22;
      uVar25 = ~uVar23 & uVar30 ^ uVar27;
      uVar22 = ~uVar22 & uVar27 ^ uVar17;
      uVar23 = ~uVar30 & uVar17 ^ uVar23;
      uVar2 = uVar2 ^ uVar34;
      uVar17 = uVar2 >> 0x24 | uVar2 << 0x1c;
      uVar21 = uVar21 ^ uVar19;
      uVar2 = uVar21 >> 0x2c | uVar21 << 0x14;
      uVar4 = uVar4 ^ uVar35;
      uVar27 = uVar4 >> 0x3d | uVar4 << 3;
      uVar40 = uVar40 ^ uVar37;
      uVar9 = uVar40 >> 0x13 | uVar40 << 0x2d;
      uVar32 = uVar32 ^ uVar1;
      uVar21 = uVar32 >> 3 | uVar32 << 0x3d;
      uVar15 = ~uVar21 & uVar17 ^ uVar9;
      uVar38 = ~uVar9 & uVar21 ^ uVar27;
      uVar4 = ~uVar2 & uVar27 ^ uVar17;
      uVar27 = ~uVar27 & uVar9 ^ uVar2;
      uVar21 = ~uVar17 & uVar2 ^ uVar21;
      uVar36 = uVar36 ^ uVar37;
      uVar17 = uVar36 >> 0x3f | uVar36 << 1;
      uVar28 = uVar28 ^ uVar1;
      uVar2 = uVar28 >> 0x3a | uVar28 << 6;
      uVar8 = uVar8 ^ uVar34;
      uVar32 = uVar8 >> 0x27 | uVar8 << 0x19;
      uVar13 = uVar13 ^ uVar19;
      uVar9 = uVar13 >> 0x38 | uVar13 << 8;
      uVar12 = uVar12 ^ uVar35;
      uVar13 = uVar12 >> 0x2e | uVar12 << 0x12;
      uVar8 = ~uVar13 & uVar17 ^ uVar9;
      uVar36 = ~uVar9 & uVar13 ^ uVar32;
      uVar12 = ~uVar2 & uVar32 ^ uVar17;
      uVar28 = ~uVar32 & uVar9 ^ uVar2;
      uVar13 = ~uVar17 & uVar2 ^ uVar13;
      uVar7 = uVar7 ^ uVar19;
      uVar2 = uVar7 >> 0x25 | uVar7 << 0x1b;
      uVar3 = uVar3 ^ uVar35;
      uVar3 = uVar3 >> 0x1c | uVar3 << 0x24;
      uVar10 = uVar10 ^ uVar37;
      uVar7 = uVar10 >> 0x36 | uVar10 << 10;
      uVar9 = ~uVar3 & uVar7 ^ uVar2;
      uVar6 = uVar6 ^ uVar1;
      uVar6 = uVar6 >> 0x31 | uVar6 << 0xf;
      uVar32 = ~uVar7 & uVar6 ^ uVar3;
      uVar39 = uVar39 ^ uVar34;
      uVar17 = uVar39 >> 8 | uVar39 << 0x38;
      uVar7 = ~uVar6 & uVar17 ^ uVar7;
      uVar6 = ~uVar17 & uVar2 ^ uVar6;
      uVar17 = ~uVar2 & uVar3 ^ uVar17;
      uVar1 = uVar1 ^ uVar18;
      uVar34 = uVar34 ^ uVar24;
      uVar19 = uVar19 ^ uVar26;
      uVar35 = uVar35 ^ uVar11;
      uVar37 = uVar37 ^ uVar29;
      uVar1 = uVar1 >> 2 | uVar1 << 0x3e;
      uVar11 = uVar34 >> 9 | uVar34 << 0x37;
      uVar26 = uVar19 >> 0x19 | uVar19 << 0x27;
      uVar39 = uVar35 >> 0x17 | uVar35 << 0x29;
      uVar40 = uVar37 >> 0x3e | uVar37 << 2;
      uVar2 = ~uVar40 & uVar1 ^ uVar39;
      uVar18 = ~uVar39 & uVar40 ^ uVar26;
      uVar3 = ~uVar11 & uVar26 ^ uVar1;
      uVar5 = ~uVar26 & uVar39 ^ uVar11;
      uVar40 = ~uVar1 & uVar11 ^ uVar40;
      uVar10 = uVar12 ^ uVar9 ^ uVar33 ^ uVar4 ^ uVar3;
      uVar11 = uVar28 ^ uVar32 ^ uVar22 ^ uVar27 ^ uVar5;
      uVar39 = uVar36 ^ uVar7 ^ uVar14 ^ uVar38 ^ uVar18;
      uVar1 = uVar8 ^ uVar6 ^ uVar25 ^ uVar15 ^ uVar2;
      uVar26 = uVar13 ^ uVar17 ^ uVar23 ^ uVar21 ^ uVar40;
      uVar29 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar11;
      uVar31 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar26;
      uVar30 = (uVar26 >> 0x3f | uVar26 << 1) ^ uVar39;
      uVar24 = (uVar39 >> 0x3f | uVar39 << 1) ^ uVar10;
      uVar1 = (uVar10 >> 0x3f | uVar10 << 1) ^ uVar1;
      uVar33 = uVar33 ^ uVar31;
      uVar27 = uVar27 ^ uVar24;
      uVar11 = uVar27 >> 0x14 | uVar27 << 0x2c;
      uVar36 = uVar36 ^ uVar29;
      uVar26 = uVar36 >> 0x15 | uVar36 << 0x2b;
      uVar19 = uVar33 ^ 0x8000000080008081 ^ ~uVar11 & uVar26;
      uVar6 = uVar6 ^ uVar30;
      uVar39 = uVar6 >> 0x2b | uVar6 << 0x15;
      uVar40 = uVar40 ^ uVar1;
      uVar36 = uVar40 >> 0x32 | uVar40 << 0xe;
      uVar40 = ~uVar39 & uVar36 ^ uVar26;
      uVar6 = ~uVar26 & uVar39 ^ uVar11;
      uVar39 = ~uVar36 & uVar33 ^ uVar39;
      uVar36 = ~uVar33 & uVar11 ^ uVar36;
      uVar25 = uVar25 ^ uVar30;
      uVar11 = uVar25 >> 0x24 | uVar25 << 0x1c;
      uVar21 = uVar21 ^ uVar1;
      uVar10 = uVar21 >> 0x2c | uVar21 << 0x14;
      uVar12 = uVar12 ^ uVar31;
      uVar26 = uVar12 >> 0x3d | uVar12 << 3;
      uVar32 = uVar32 ^ uVar24;
      uVar27 = uVar32 >> 0x13 | uVar32 << 0x2d;
      uVar18 = uVar18 ^ uVar29;
      uVar21 = uVar18 >> 3 | uVar18 << 0x3d;
      uVar37 = ~uVar21 & uVar11 ^ uVar27;
      uVar18 = ~uVar27 & uVar21 ^ uVar26;
      uVar25 = ~uVar10 & uVar26 ^ uVar11;
      uVar27 = ~uVar26 & uVar27 ^ uVar10;
      uVar21 = ~uVar11 & uVar10 ^ uVar21;
      uVar22 = uVar22 ^ uVar24;
      uVar11 = uVar22 >> 0x3f | uVar22 << 1;
      uVar38 = uVar38 ^ uVar29;
      uVar32 = uVar38 >> 0x3a | uVar38 << 6;
      uVar8 = uVar8 ^ uVar30;
      uVar22 = uVar8 >> 0x27 | uVar8 << 0x19;
      uVar17 = uVar17 ^ uVar1;
      uVar17 = uVar17 >> 0x38 | uVar17 << 8;
      uVar3 = uVar3 ^ uVar31;
      uVar26 = uVar3 >> 0x2e | uVar3 << 0x12;
      uVar3 = ~uVar26 & uVar11 ^ uVar17;
      uVar33 = ~uVar17 & uVar26 ^ uVar22;
      uVar38 = ~uVar32 & uVar22 ^ uVar11;
      uVar22 = ~uVar22 & uVar17 ^ uVar32;
      uVar26 = ~uVar11 & uVar32 ^ uVar26;
      uVar23 = uVar23 ^ uVar1;
      uVar17 = uVar23 >> 0x25 | uVar23 << 0x1b;
      uVar4 = uVar4 ^ uVar31;
      uVar23 = uVar4 >> 0x1c | uVar4 << 0x24;
      uVar28 = uVar28 ^ uVar24;
      uVar32 = uVar28 >> 0x36 | uVar28 << 10;
      uVar10 = ~uVar23 & uVar32 ^ uVar17;
      uVar7 = uVar7 ^ uVar29;
      uVar7 = uVar7 >> 0x31 | uVar7 << 0xf;
      uVar12 = ~uVar32 & uVar7 ^ uVar23;
      uVar2 = uVar2 ^ uVar30;
      uVar11 = uVar2 >> 8 | uVar2 << 0x38;
      uVar32 = ~uVar7 & uVar11 ^ uVar32;
      uVar7 = ~uVar11 & uVar17 ^ uVar7;
      uVar11 = ~uVar17 & uVar23 ^ uVar11;
      uVar29 = uVar29 ^ uVar14;
      uVar30 = uVar30 ^ uVar15;
      uVar1 = uVar1 ^ uVar13;
      uVar31 = uVar31 ^ uVar9;
      uVar24 = uVar24 ^ uVar5;
      uVar9 = uVar29 >> 2 | uVar29 << 0x3e;
      uVar13 = uVar30 >> 9 | uVar30 << 0x37;
      uVar2 = uVar1 >> 0x19 | uVar1 << 0x27;
      uVar17 = uVar31 >> 0x17 | uVar31 << 0x29;
      uVar23 = uVar24 >> 0x3e | uVar24 << 2;
      uVar24 = ~uVar23 & uVar9 ^ uVar17;
      uVar30 = ~uVar17 & uVar23 ^ uVar2;
      uVar14 = ~uVar13 & uVar2 ^ uVar9;
      uVar4 = ~uVar2 & uVar17 ^ uVar13;
      uVar23 = ~uVar9 & uVar13 ^ uVar23;
      uVar9 = uVar38 ^ uVar10 ^ uVar19 ^ uVar25 ^ uVar14;
      uVar13 = uVar22 ^ uVar12 ^ uVar6 ^ uVar27 ^ uVar4;
      uVar17 = uVar33 ^ uVar32 ^ uVar40 ^ uVar18 ^ uVar30;
      uVar1 = uVar3 ^ uVar7 ^ uVar39 ^ uVar37 ^ uVar24;
      uVar2 = uVar26 ^ uVar11 ^ uVar36 ^ uVar21 ^ uVar23;
      uVar8 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar13;
      uVar13 = (uVar13 >> 0x3f | uVar13 << 1) ^ uVar2;
      uVar29 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar17;
      uVar34 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar9;
      uVar1 = (uVar9 >> 0x3f | uVar9 << 1) ^ uVar1;
      uVar19 = uVar19 ^ uVar13;
      uVar27 = uVar27 ^ uVar34;
      uVar17 = uVar27 >> 0x14 | uVar27 << 0x2c;
      uVar33 = uVar33 ^ uVar8;
      uVar27 = uVar33 >> 0x15 | uVar33 << 0x2b;
      uVar28 = uVar19 ^ 0x8000000000008080 ^ ~uVar17 & uVar27;
      uVar7 = uVar7 ^ uVar29;
      uVar9 = uVar7 >> 0x2b | uVar7 << 0x15;
      uVar23 = uVar23 ^ uVar1;
      uVar23 = uVar23 >> 0x32 | uVar23 << 0xe;
      uVar31 = ~uVar9 & uVar23 ^ uVar27;
      uVar2 = ~uVar23 & uVar19 ^ uVar9;
      uVar9 = ~uVar27 & uVar9 ^ uVar17;
      uVar23 = ~uVar19 & uVar17 ^ uVar23;
      uVar39 = uVar39 ^ uVar29;
      uVar17 = uVar39 >> 0x24 | uVar39 << 0x1c;
      uVar21 = uVar21 ^ uVar1;
      uVar39 = uVar21 >> 0x2c | uVar21 << 0x14;
      uVar38 = uVar38 ^ uVar13;
      uVar27 = uVar38 >> 0x3d | uVar38 << 3;
      uVar12 = uVar12 ^ uVar34;
      uVar38 = uVar12 >> 0x13 | uVar12 << 0x2d;
      uVar30 = uVar30 ^ uVar8;
      uVar21 = uVar30 >> 3 | uVar30 << 0x3d;
      uVar33 = ~uVar21 & uVar17 ^ uVar38;
      uVar5 = ~uVar38 & uVar21 ^ uVar27;
      uVar12 = ~uVar39 & uVar27 ^ uVar17;
      uVar30 = ~uVar27 & uVar38 ^ uVar39;
      uVar21 = ~uVar17 & uVar39 ^ uVar21;
      uVar6 = uVar6 ^ uVar34;
      uVar17 = uVar6 >> 0x3f | uVar6 << 1;
      uVar18 = uVar18 ^ uVar8;
      uVar27 = uVar18 >> 0x3a | uVar18 << 6;
      uVar3 = uVar3 ^ uVar29;
      uVar39 = uVar3 >> 0x27 | uVar3 << 0x19;
      uVar11 = uVar11 ^ uVar1;
      uVar6 = uVar11 >> 0x38 | uVar11 << 8;
      uVar14 = uVar14 ^ uVar13;
      uVar11 = uVar14 >> 0x2e | uVar14 << 0x12;
      uVar14 = ~uVar11 & uVar17 ^ uVar6;
      uVar15 = ~uVar6 & uVar11 ^ uVar39;
      uVar7 = ~uVar27 & uVar39 ^ uVar17;
      uVar38 = ~uVar39 & uVar6 ^ uVar27;
      uVar11 = ~uVar17 & uVar27 ^ uVar11;
      uVar36 = uVar36 ^ uVar1;
      uVar6 = uVar36 >> 0x25 | uVar36 << 0x1b;
      uVar25 = uVar25 ^ uVar13;
      uVar39 = uVar25 >> 0x1c | uVar25 << 0x24;
      uVar22 = uVar22 ^ uVar34;
      uVar18 = uVar22 >> 0x36 | uVar22 << 10;
      uVar17 = ~uVar39 & uVar18 ^ uVar6;
      uVar32 = uVar32 ^ uVar8;
      uVar27 = uVar32 >> 0x31 | uVar32 << 0xf;
      uVar3 = ~uVar18 & uVar27 ^ uVar39;
      uVar24 = uVar24 ^ uVar29;
      uVar36 = uVar24 >> 8 | uVar24 << 0x38;
      uVar18 = ~uVar27 & uVar36 ^ uVar18;
      uVar27 = ~uVar36 & uVar6 ^ uVar27;
      uVar36 = ~uVar6 & uVar39 ^ uVar36;
      uVar8 = uVar8 ^ uVar40;
      uVar29 = uVar29 ^ uVar37;
      uVar1 = uVar1 ^ uVar26;
      uVar13 = uVar13 ^ uVar10;
      uVar34 = uVar34 ^ uVar4;
      uVar26 = uVar8 >> 2 | uVar8 << 0x3e;
      uVar6 = uVar29 >> 9 | uVar29 << 0x37;
      uVar25 = uVar1 >> 0x19 | uVar1 << 0x27;
      uVar22 = uVar13 >> 0x17 | uVar13 << 0x29;
      uVar13 = uVar34 >> 0x3e | uVar34 << 2;
      uVar39 = ~uVar13 & uVar26 ^ uVar22;
      uVar1 = ~uVar22 & uVar13 ^ uVar25;
      uVar32 = ~uVar6 & uVar25 ^ uVar26;
      uVar34 = ~uVar25 & uVar22 ^ uVar6;
      uVar13 = ~uVar26 & uVar6 ^ uVar13;
      uVar6 = uVar7 ^ uVar17 ^ uVar28 ^ uVar12 ^ uVar32;
      uVar26 = uVar38 ^ uVar3 ^ uVar9 ^ uVar30 ^ uVar34;
      uVar25 = uVar15 ^ uVar18 ^ uVar31 ^ uVar5 ^ uVar1;
      uVar19 = uVar14 ^ uVar27 ^ uVar2 ^ uVar33 ^ uVar39;
      uVar22 = uVar11 ^ uVar36 ^ uVar23 ^ uVar21 ^ uVar13;
      uVar8 = (uVar19 >> 0x3f | uVar19 << 1) ^ uVar26;
      uVar37 = (uVar26 >> 0x3f | uVar26 << 1) ^ uVar22;
      uVar40 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar25;
      uVar29 = (uVar25 >> 0x3f | uVar25 << 1) ^ uVar6;
      uVar19 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar19;
      uVar28 = uVar28 ^ uVar37;
      uVar30 = uVar30 ^ uVar29;
      uVar26 = uVar30 >> 0x14 | uVar30 << 0x2c;
      uVar15 = uVar15 ^ uVar8;
      uVar22 = uVar15 >> 0x15 | uVar15 << 0x2b;
      uVar30 = uVar28 ^ 0x80000001 ^ ~uVar26 & uVar22;
      uVar27 = uVar27 ^ uVar40;
      uVar25 = uVar27 >> 0x2b | uVar27 << 0x15;
      uVar13 = uVar13 ^ uVar19;
      uVar6 = uVar13 >> 0x32 | uVar13 << 0xe;
      uVar24 = ~uVar25 & uVar6 ^ uVar22;
      uVar22 = ~uVar22 & uVar25 ^ uVar26;
      uVar25 = ~uVar6 & uVar28 ^ uVar25;
      uVar6 = ~uVar28 & uVar26 ^ uVar6;
      uVar2 = uVar2 ^ uVar40;
      uVar26 = uVar2 >> 0x24 | uVar2 << 0x1c;
      uVar21 = uVar21 ^ uVar19;
      uVar13 = uVar21 >> 0x2c | uVar21 << 0x14;
      uVar7 = uVar7 ^ uVar37;
      uVar27 = uVar7 >> 0x3d | uVar7 << 3;
      uVar3 = uVar3 ^ uVar29;
      uVar2 = uVar3 >> 0x13 | uVar3 << 0x2d;
      uVar1 = uVar1 ^ uVar8;
      uVar21 = uVar1 >> 3 | uVar1 << 0x3d;
      uVar28 = ~uVar21 & uVar26 ^ uVar2;
      uVar1 = ~uVar2 & uVar21 ^ uVar27;
      uVar10 = ~uVar13 & uVar27 ^ uVar26;
      uVar27 = ~uVar27 & uVar2 ^ uVar13;
      uVar21 = ~uVar26 & uVar13 ^ uVar21;
      uVar9 = uVar9 ^ uVar29;
      uVar26 = uVar9 >> 0x3f | uVar9 << 1;
      uVar5 = uVar5 ^ uVar8;
      uVar2 = uVar5 >> 0x3a | uVar5 << 6;
      uVar14 = uVar14 ^ uVar40;
      uVar9 = uVar14 >> 0x27 | uVar14 << 0x19;
      uVar36 = uVar36 ^ uVar19;
      uVar4 = uVar36 >> 0x38 | uVar36 << 8;
      uVar32 = uVar32 ^ uVar37;
      uVar13 = uVar32 >> 0x2e | uVar32 << 0x12;
      uVar3 = ~uVar13 & uVar26 ^ uVar4;
      uVar36 = ~uVar4 & uVar13 ^ uVar9;
      uVar7 = ~uVar2 & uVar9 ^ uVar26;
      uVar4 = ~uVar9 & uVar4 ^ uVar2;
      uVar13 = ~uVar26 & uVar2 ^ uVar13;
      uVar23 = uVar23 ^ uVar19;
      uVar5 = uVar23 >> 0x25 | uVar23 << 0x1b;
      uVar12 = uVar12 ^ uVar37;
      uVar12 = uVar12 >> 0x1c | uVar12 << 0x24;
      uVar38 = uVar38 ^ uVar29;
      uVar26 = uVar38 >> 0x36 | uVar38 << 10;
      uVar23 = ~uVar12 & uVar26 ^ uVar5;
      uVar18 = uVar18 ^ uVar8;
      uVar2 = uVar18 >> 0x31 | uVar18 << 0xf;
      uVar32 = ~uVar26 & uVar2 ^ uVar12;
      uVar39 = uVar39 ^ uVar40;
      uVar9 = uVar39 >> 8 | uVar39 << 0x38;
      uVar26 = ~uVar2 & uVar9 ^ uVar26;
      uVar2 = ~uVar9 & uVar5 ^ uVar2;
      uVar9 = ~uVar5 & uVar12 ^ uVar9;
      uVar8 = uVar8 ^ uVar31;
      uVar40 = uVar40 ^ uVar33;
      uVar19 = uVar19 ^ uVar11;
      uVar37 = uVar37 ^ uVar17;
      uVar29 = uVar29 ^ uVar34;
      uVar39 = uVar8 >> 2 | uVar8 << 0x3e;
      uVar11 = uVar40 >> 9 | uVar40 << 0x37;
      uVar17 = uVar19 >> 0x19 | uVar19 << 0x27;
      uVar18 = uVar37 >> 0x17 | uVar37 << 0x29;
      uVar12 = uVar29 >> 0x3e | uVar29 << 2;
      uVar38 = ~uVar12 & uVar39 ^ uVar18;
      uVar15 = ~uVar18 & uVar12 ^ uVar17;
      uVar31 = ~uVar11 & uVar17 ^ uVar39;
      uVar19 = ~uVar17 & uVar18 ^ uVar11;
      uVar12 = ~uVar39 & uVar11 ^ uVar12;
      uVar11 = uVar7 ^ uVar23 ^ uVar30 ^ uVar10 ^ uVar31;
      uVar18 = uVar4 ^ uVar32 ^ uVar22 ^ uVar27 ^ uVar19;
      uVar14 = uVar36 ^ uVar26 ^ uVar24 ^ uVar1 ^ uVar15;
      uVar39 = uVar3 ^ uVar2 ^ uVar25 ^ uVar28 ^ uVar38;
      uVar17 = uVar13 ^ uVar9 ^ uVar6 ^ uVar21 ^ uVar12;
      uVar5 = (uVar39 >> 0x3f | uVar39 << 1) ^ uVar18;
      uVar33 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar17;
      uVar8 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar14;
      uVar18 = (uVar14 >> 0x3f | uVar14 << 1) ^ uVar11;
      uVar39 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar39;
      uVar30 = uVar30 ^ uVar33;
      uVar27 = uVar27 ^ uVar18;
      uVar11 = uVar27 >> 0x14 | uVar27 << 0x2c;
      uVar36 = uVar36 ^ uVar5;
      uVar17 = uVar36 >> 0x15 | uVar36 << 0x2b;
      local_140 = uVar30 ^ 0x8000000080008008 ^ ~uVar11 & uVar17;
      uVar2 = uVar2 ^ uVar8;
      uVar27 = uVar2 >> 0x2b | uVar2 << 0x15;
      uVar12 = uVar12 ^ uVar39;
      local_e0 = uVar12 >> 0x32 | uVar12 << 0xe;
      local_d0 = ~uVar27 & local_e0 ^ uVar17;
      local_130 = ~local_e0 & uVar30 ^ uVar27;
      local_138 = ~uVar17 & uVar27 ^ uVar11;
      local_e0 = ~uVar30 & uVar11 ^ local_e0;
      uVar25 = uVar25 ^ uVar8;
      uVar11 = uVar25 >> 0x24 | uVar25 << 0x1c;
      uVar21 = uVar21 ^ uVar39;
      uVar21 = uVar21 >> 0x2c | uVar21 << 0x14;
      uVar7 = uVar7 ^ uVar33;
      uVar17 = uVar7 >> 0x3d | uVar7 << 3;
      uVar32 = uVar32 ^ uVar18;
      uVar27 = uVar32 >> 0x13 | uVar32 << 0x2d;
      uVar15 = uVar15 ^ uVar5;
      local_120 = uVar15 >> 3 | uVar15 << 0x3d;
      local_f0 = ~local_120 & uVar11 ^ uVar27;
      local_d8 = ~uVar27 & local_120 ^ uVar17;
      local_e8 = ~uVar21 & uVar17 ^ uVar11;
      local_128 = ~uVar17 & uVar27 ^ uVar21;
      local_120 = ~uVar11 & uVar21 ^ local_120;
      uVar22 = uVar22 ^ uVar18;
      uVar21 = uVar22 >> 0x3f | uVar22 << 1;
      uVar1 = uVar1 ^ uVar5;
      uVar17 = uVar1 >> 0x3a | uVar1 << 6;
      uVar3 = uVar3 ^ uVar8;
      uVar27 = uVar3 >> 0x27 | uVar3 << 0x19;
      uVar9 = uVar9 ^ uVar39;
      uVar2 = uVar9 >> 0x38 | uVar9 << 8;
      uVar31 = uVar31 ^ uVar33;
      uVar11 = uVar31 >> 0x2e | uVar31 << 0x12;
      local_148 = ~uVar11 & uVar21 ^ uVar2;
      local_118 = ~uVar2 & uVar11 ^ uVar27;
      local_f8 = ~uVar17 & uVar27 ^ uVar21;
      local_100 = ~uVar27 & uVar2 ^ uVar17;
      uVar11 = ~uVar21 & uVar17 ^ uVar11;
      uVar6 = uVar6 ^ uVar39;
      uVar17 = uVar6 >> 0x25 | uVar6 << 0x1b;
      uVar10 = uVar10 ^ uVar33;
      uVar27 = uVar10 >> 0x1c | uVar10 << 0x24;
      uVar4 = uVar4 ^ uVar18;
      uVar2 = uVar4 >> 0x36 | uVar4 << 10;
      uVar26 = uVar26 ^ uVar5;
      uVar26 = uVar26 >> 0x31 | uVar26 << 0xf;
      uVar38 = uVar38 ^ uVar8;
      local_158 = uVar38 >> 8 | uVar38 << 0x38;
      local_110 = ~local_158 & uVar17 ^ uVar26;
      local_150 = ~uVar26 & local_158 ^ uVar2;
      uVar21 = ~uVar27 & uVar2 ^ uVar17;
      local_108 = ~uVar2 & uVar26 ^ uVar27;
      local_158 = ~uVar17 & uVar27 ^ local_158;
      uVar5 = uVar5 ^ uVar24;
      uVar8 = uVar8 ^ uVar28;
      uVar39 = uVar39 ^ uVar13;
      uVar33 = uVar33 ^ uVar23;
      uVar18 = uVar18 ^ uVar19;
      uVar13 = uVar5 >> 2 | uVar5 << 0x3e;
      uVar17 = uVar8 >> 9 | uVar8 << 0x37;
      uVar23 = uVar39 >> 0x19 | uVar39 << 0x27;
      uVar27 = uVar33 >> 0x17 | uVar33 << 0x29;
      local_c0 = uVar18 >> 0x3e | uVar18 << 2;
      local_b8 = ~local_c0 & uVar13 ^ uVar27;
      local_c8 = ~uVar27 & local_c0 ^ uVar23;
      uVar26 = ~uVar17 & uVar23 ^ uVar13;
      local_98 = ~uVar23 & uVar27 ^ uVar17;
      local_c0 = ~uVar13 & uVar17 ^ local_c0;
      uVar20 = uVar20 - uVar16;
      data = (uchar *)((long)data + (ulong)laneCount * 8);
    } while (uVar16 <= uVar20);
  }
  *(ulong *)state = local_140;
  *(ulong *)((long)state + 8) = local_138;
  *(ulong *)((long)state + 0x10) = local_d0;
  *(ulong *)((long)state + 0x18) = local_130;
  *(ulong *)((long)state + 0x20) = local_e0;
  *(ulong *)((long)state + 0x28) = local_e8;
  *(ulong *)((long)state + 0x30) = local_128;
  *(ulong *)((long)state + 0x38) = local_d8;
  *(ulong *)((long)state + 0x40) = local_f0;
  *(ulong *)((long)state + 0x48) = local_120;
  *(ulong *)((long)state + 0x50) = local_f8;
  *(ulong *)((long)state + 0x58) = local_100;
  *(ulong *)((long)state + 0x60) = local_118;
  *(ulong *)((long)state + 0x68) = local_148;
  *(ulong *)((long)state + 0x70) = uVar11;
  *(ulong *)((long)state + 0x78) = uVar21;
  *(ulong *)((long)state + 0x80) = local_108;
  *(ulong *)((long)state + 0x88) = local_150;
  *(ulong *)((long)state + 0x90) = local_110;
  *(ulong *)((long)state + 0x98) = local_158;
  *(ulong *)((long)state + 0xa0) = uVar26;
  *(ulong *)((long)state + 0xa8) = local_98;
  *(ulong *)((long)state + 0xb0) = local_c8;
  *(ulong *)((long)state + 0xb8) = local_b8;
  *(ulong *)((long)state + 0xc0) = local_c0;
  return dataByteLen - uVar20;
}

Assistant:

size_t KeccakF1600_FastLoop_Absorb(void *state, unsigned int laneCount, const unsigned char *data, size_t dataByteLen)
{
    size_t originalDataByteLen = dataByteLen;
    declareABCDE
    #ifndef KeccakP1600_fullUnrolling
    unsigned int i;
    #endif
    uint64_t *stateAsLanes = (uint64_t*)state;
    uint64_t *inDataAsLanes = (uint64_t*)data;

    copyFromState(A, stateAsLanes)
    while(dataByteLen >= laneCount*8) {
        addInput(A, inDataAsLanes, laneCount)
        rounds24
        inDataAsLanes += laneCount;
        dataByteLen -= laneCount*8;
    }
    copyToState(stateAsLanes, A)
    return originalDataByteLen - dataByteLen;
}